

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack8.h
# Opt level: O3

void ncnn::convdw3x3s1_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  void **ppvVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  void *pvVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float *pfVar239;
  float *pfVar240;
  int iVar241;
  float *pfVar242;
  long lVar243;
  long lVar244;
  uint uVar245;
  uint uVar246;
  long lVar247;
  int iVar248;
  uint uVar249;
  float *pfVar250;
  long lVar251;
  float *pfVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float in_register_000012dc;
  float fVar258;
  float fVar259;
  float fVar260;
  float in_register_0000135c;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  float in_register_0000139c;
  float fVar265;
  float fVar266;
  float in_register_000013dc;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  float in_register_0000141c;
  float fVar272;
  float in_register_0000145c;
  float in_register_0000149c;
  float fVar273;
  float in_register_000014dc;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float in_register_0000151c;
  float fVar278;
  float fVar279;
  float in_register_0000155c;
  float in_register_0000159c;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  
  iVar21 = bottom_blob->c;
  if (0 < (long)iVar21) {
    uVar22 = top_blob->w;
    uVar23 = top_blob->h;
    lVar2 = (long)bottom_blob->w * 8 + 0x10;
    lVar244 = 0;
    do {
      if (_bias == (Mat *)0x0) {
        fVar280 = 0.0;
        fVar281 = 0.0;
        fVar282 = 0.0;
        fVar283 = 0.0;
        fVar284 = 0.0;
        fVar285 = 0.0;
        fVar286 = 0.0;
        fVar287 = 0.0;
      }
      else {
        ppvVar1 = &_bias->data + lVar244 * 4;
        fVar280 = *(float *)ppvVar1;
        fVar281 = *(float *)((long)ppvVar1 + 4);
        fVar282 = *(float *)(ppvVar1 + 1);
        fVar283 = *(float *)((long)ppvVar1 + 0xc);
        fVar284 = *(float *)(ppvVar1 + 2);
        fVar285 = *(float *)((long)ppvVar1 + 0x14);
        fVar286 = *(float *)(ppvVar1 + 3);
        fVar287 = *(float *)((long)ppvVar1 + 0x1c);
      }
      pfVar250 = (float *)(top_blob->cstep * lVar244 * top_blob->elemsize + (long)top_blob->data);
      lVar251 = kernel->w * lVar244 * kernel->elemsize;
      pfVar239 = (float *)(bottom_blob->cstep * lVar244 * bottom_blob->elemsize +
                          (long)bottom_blob->data);
      lVar247 = (long)bottom_blob->w * bottom_blob->elemsize;
      pfVar252 = (float *)((long)pfVar239 + lVar247);
      pvVar24 = kernel->data;
      pfVar240 = (float *)((long)pfVar239 + lVar247 * 2);
      uVar249 = 0;
      if (1 < (int)uVar23) {
        lVar247 = lVar247 * 3 + (long)pfVar239;
        pfVar242 = (float *)(top_blob->elemsize * (long)top_blob->w + (long)pfVar250);
        iVar241 = 0;
        do {
          if ((int)uVar22 < 4) {
            uVar249 = 0;
          }
          else {
            iVar248 = 3;
            lVar243 = 0;
            do {
              pfVar3 = (float *)((long)pfVar239 + lVar243 + 0x20);
              fVar25 = *pfVar3;
              fVar26 = pfVar3[1];
              fVar27 = pfVar3[2];
              fVar28 = pfVar3[3];
              fVar29 = pfVar3[4];
              fVar30 = pfVar3[5];
              fVar31 = pfVar3[6];
              pfVar4 = (float *)((long)pfVar239 + lVar243 + 0x40);
              fVar32 = *pfVar4;
              fVar33 = pfVar4[1];
              fVar34 = pfVar4[2];
              fVar35 = pfVar4[3];
              fVar36 = pfVar4[4];
              fVar37 = pfVar4[5];
              fVar38 = pfVar4[6];
              pfVar5 = (float *)((long)pfVar239 + lVar243 + 0x60);
              fVar39 = *pfVar5;
              fVar40 = pfVar5[1];
              fVar41 = pfVar5[2];
              fVar42 = pfVar5[3];
              fVar43 = pfVar5[4];
              fVar44 = pfVar5[5];
              fVar45 = pfVar5[6];
              fVar46 = pfVar5[7];
              pfVar5 = (float *)((long)pfVar239 + lVar243 + 0x80);
              fVar47 = *pfVar5;
              fVar48 = pfVar5[1];
              fVar49 = pfVar5[2];
              fVar50 = pfVar5[3];
              fVar51 = pfVar5[4];
              fVar52 = pfVar5[5];
              fVar53 = pfVar5[6];
              pfVar12 = (float *)((long)pvVar24 + lVar251);
              fVar54 = *pfVar12;
              fVar55 = pfVar12[1];
              fVar56 = pfVar12[2];
              fVar57 = pfVar12[3];
              fVar58 = pfVar12[4];
              fVar59 = pfVar12[5];
              fVar60 = pfVar12[6];
              pfVar6 = (float *)((long)pvVar24 + lVar251 + 0x20);
              fVar61 = *pfVar6;
              fVar62 = pfVar6[1];
              fVar63 = pfVar6[2];
              fVar64 = pfVar6[3];
              fVar65 = pfVar6[4];
              fVar66 = pfVar6[5];
              fVar67 = pfVar6[6];
              pfVar7 = (float *)((long)pvVar24 + lVar251 + 0x40);
              fVar68 = *pfVar7;
              fVar69 = pfVar7[1];
              fVar70 = pfVar7[2];
              fVar71 = pfVar7[3];
              fVar72 = pfVar7[4];
              fVar73 = pfVar7[5];
              fVar74 = pfVar7[6];
              pfVar8 = (float *)((long)pvVar24 + lVar251 + 0x60);
              fVar75 = *pfVar8;
              fVar76 = pfVar8[1];
              fVar77 = pfVar8[2];
              fVar78 = pfVar8[3];
              fVar79 = pfVar8[4];
              fVar80 = pfVar8[5];
              fVar81 = pfVar8[6];
              pfVar5 = (float *)((long)pfVar239 + lVar243);
              fVar82 = pfVar5[1];
              fVar83 = pfVar5[2];
              fVar84 = pfVar5[3];
              fVar85 = pfVar5[4];
              fVar86 = pfVar5[5];
              fVar87 = pfVar5[6];
              fVar253 = in_register_0000141c + fVar287 + pfVar3[7] + pfVar4[7];
              fVar254 = in_register_0000145c + fVar287 + in_register_0000151c + fVar253;
              fVar255 = in_register_0000149c + fVar287 + in_register_0000155c + fVar254;
              pfVar3 = (float *)((long)pfVar239 + lVar243 + 0xa0);
              fVar88 = *pfVar3;
              fVar89 = pfVar3[1];
              fVar90 = pfVar3[2];
              fVar91 = pfVar3[3];
              fVar92 = pfVar3[4];
              fVar93 = pfVar3[5];
              fVar94 = pfVar3[6];
              fVar256 = in_register_000014dc + fVar287 + in_register_0000159c + fVar255;
              pfVar14 = (float *)((long)pvVar24 + lVar251 + 0x80);
              fVar95 = *pfVar14;
              fVar96 = pfVar14[1];
              fVar97 = pfVar14[2];
              fVar98 = pfVar14[3];
              fVar99 = pfVar14[4];
              fVar100 = pfVar14[5];
              fVar101 = pfVar14[6];
              pfVar3 = (float *)((long)pfVar252 + lVar243);
              fVar102 = *pfVar3;
              fVar103 = pfVar3[1];
              fVar104 = pfVar3[2];
              fVar105 = pfVar3[3];
              fVar106 = pfVar3[4];
              fVar107 = pfVar3[5];
              fVar108 = pfVar3[6];
              pfVar4 = (float *)((long)pfVar252 + lVar243 + 0x20);
              fVar109 = *pfVar4;
              fVar110 = pfVar4[1];
              fVar111 = pfVar4[2];
              fVar112 = pfVar4[3];
              fVar113 = pfVar4[4];
              fVar114 = pfVar4[5];
              fVar115 = pfVar4[6];
              fVar116 = pfVar4[7];
              pfVar4 = (float *)((long)pfVar252 + lVar243 + 0x40);
              fVar117 = *pfVar4;
              fVar118 = pfVar4[1];
              fVar119 = pfVar4[2];
              fVar120 = pfVar4[3];
              fVar121 = pfVar4[4];
              fVar122 = pfVar4[5];
              fVar123 = pfVar4[6];
              pfVar4 = (float *)((long)pfVar252 + lVar243 + 0x60);
              fVar124 = *pfVar4;
              fVar125 = pfVar4[1];
              fVar126 = pfVar4[2];
              fVar268 = pfVar4[3];
              fVar270 = pfVar4[4];
              fVar127 = pfVar4[5];
              fVar128 = pfVar4[6];
              fVar272 = in_register_0000141c + fVar287 + fVar256;
              pfVar15 = (float *)((long)pfVar252 + lVar243 + 0x80);
              fVar129 = *pfVar15;
              fVar130 = pfVar15[1];
              fVar131 = pfVar15[2];
              fVar132 = pfVar15[3];
              fVar133 = pfVar15[4];
              fVar134 = pfVar15[5];
              fVar135 = pfVar15[6];
              fVar278 = pfVar3[7] + fVar287;
              fVar274 = fVar278 + in_register_0000155c + in_register_000014dc + fVar287;
              fVar275 = fVar274 + fVar278;
              fVar267 = fVar278 + fVar287 + fVar275 + fVar278;
              pfVar3 = (float *)((long)pfVar252 + lVar243 + 0xa0);
              fVar278 = *pfVar3;
              fVar136 = pfVar3[1];
              fVar137 = pfVar3[2];
              fVar138 = pfVar3[3];
              fVar139 = pfVar3[4];
              fVar140 = pfVar3[5];
              fVar141 = pfVar3[6];
              fVar259 = pfVar6[7] + pfVar7[7];
              pfVar3 = (float *)((long)pvVar24 + lVar251 + 0xa0);
              fVar142 = *pfVar3;
              fVar143 = pfVar3[1];
              fVar144 = pfVar3[2];
              fVar145 = pfVar3[3];
              fVar146 = pfVar3[4];
              fVar147 = pfVar3[5];
              fVar148 = pfVar3[6];
              fVar149 = pfVar3[7];
              fVar261 = fVar46 + fVar256 + pfVar6[7];
              fVar255 = fVar256 + fVar46 + pfVar15[7] + fVar255;
              fVar257 = in_register_0000155c + fVar46 + fVar255 + fVar256;
              pfVar3 = (float *)((long)pfVar240 + lVar243);
              fVar150 = *pfVar3;
              fVar151 = pfVar3[1];
              fVar152 = pfVar3[2];
              fVar266 = pfVar3[3];
              fVar153 = pfVar3[4];
              fVar154 = pfVar3[5];
              fVar155 = pfVar3[6];
              fVar156 = pfVar3[7];
              pfVar3 = (float *)((long)pfVar240 + lVar243 + 0x20);
              fVar157 = *pfVar3;
              fVar158 = pfVar3[1];
              fVar159 = pfVar3[2];
              fVar160 = pfVar3[3];
              fVar161 = pfVar3[4];
              fVar162 = pfVar3[5];
              fVar163 = pfVar3[6];
              pfVar6 = (float *)((long)pfVar240 + lVar243 + 0x40);
              fVar164 = *pfVar6;
              fVar165 = pfVar6[1];
              fVar166 = pfVar6[2];
              fVar167 = pfVar6[3];
              fVar168 = pfVar6[4];
              fVar169 = pfVar6[5];
              fVar170 = pfVar6[6];
              fVar288 = pfVar4[7] + fVar257;
              pfVar7 = (float *)((long)pfVar240 + lVar243 + 0x60);
              fVar171 = *pfVar7;
              fVar172 = pfVar7[1];
              fVar173 = pfVar7[2];
              fVar174 = pfVar7[3];
              fVar175 = pfVar7[4];
              fVar264 = pfVar7[5];
              fVar176 = pfVar7[6];
              pfVar15 = (float *)((long)pfVar240 + lVar243 + 0x80);
              fVar177 = *pfVar15;
              fVar178 = pfVar15[1];
              fVar179 = pfVar15[2];
              fVar180 = pfVar15[3];
              fVar181 = pfVar15[4];
              fVar182 = pfVar15[5];
              fVar183 = pfVar15[6];
              fVar184 = pfVar15[7];
              pfVar15 = (float *)((long)pvVar24 + lVar251 + 0xc0);
              fVar185 = *pfVar15;
              fVar186 = pfVar15[1];
              fVar187 = pfVar15[2];
              fVar188 = pfVar15[3];
              fVar189 = pfVar15[4];
              fVar190 = pfVar15[5];
              fVar191 = pfVar15[6];
              fVar192 = pfVar15[7];
              pfVar15 = (float *)((long)pvVar24 + lVar251 + 0xe0);
              fVar193 = *pfVar15;
              fVar194 = pfVar15[1];
              fVar195 = pfVar15[2];
              fVar196 = pfVar15[3];
              fVar197 = pfVar15[4];
              fVar198 = pfVar15[5];
              fVar199 = pfVar15[6];
              fVar200 = pfVar15[7];
              fVar274 = fVar288 + fVar156 + fVar274;
              fVar288 = fVar288 + pfVar4[7] + fVar257;
              in_register_000013dc = fVar257 + fVar267 + fVar288 + fVar267;
              pfVar4 = (float *)((long)pfVar240 + lVar243 + 0xa0);
              fVar267 = *pfVar4;
              fVar258 = pfVar4[1];
              fVar265 = pfVar4[2];
              fVar269 = pfVar4[3];
              fVar201 = pfVar4[4];
              fVar202 = pfVar4[5];
              fVar203 = pfVar4[6];
              in_register_000012dc =
                   pfVar12[7] + fVar287 + fVar259 + fVar149 + pfVar8[7] + pfVar14[7];
              pfVar8 = (float *)((long)pvVar24 + lVar251 + 0x100);
              fVar225 = *pfVar8;
              fVar226 = pfVar8[1];
              fVar227 = pfVar8[2];
              fVar228 = pfVar8[3];
              fVar229 = pfVar8[4];
              fVar230 = pfVar8[5];
              fVar231 = pfVar8[6];
              in_register_0000151c = pfVar8[7];
              fVar262 = pfVar6[7] + fVar156 + fVar261;
              in_register_0000149c = fVar262 + fVar272 + fVar259 + fVar253;
              in_register_0000135c = pfVar3[7] + fVar156 + fVar262 + fVar261 + fVar254;
              in_register_0000141c = fVar256 + fVar46 + fVar156 + pfVar4[7] + fVar257;
              pfVar3 = (float *)(lVar247 + 0x20 + lVar243);
              fVar46 = *pfVar3;
              fVar253 = pfVar3[1];
              fVar254 = pfVar3[2];
              fVar256 = pfVar3[3];
              fVar257 = pfVar3[4];
              fVar259 = pfVar3[5];
              fVar261 = pfVar3[6];
              fVar262 = pfVar3[7];
              pfVar3 = (float *)(lVar247 + 0x40 + lVar243);
              fVar260 = *pfVar3;
              fVar263 = pfVar3[1];
              fVar271 = pfVar3[2];
              fVar273 = pfVar3[3];
              fVar276 = pfVar3[4];
              fVar277 = pfVar3[5];
              fVar279 = pfVar3[6];
              in_register_0000145c = pfVar3[7];
              pfVar3 = (float *)(lVar247 + 0x60 + lVar243);
              fVar218 = *pfVar3;
              fVar219 = pfVar3[1];
              fVar220 = pfVar3[2];
              fVar221 = pfVar3[3];
              fVar222 = pfVar3[4];
              fVar223 = pfVar3[5];
              fVar224 = pfVar3[6];
              in_register_000014dc = pfVar3[7];
              pfVar3 = (float *)(lVar247 + lVar243);
              fVar204 = *pfVar3;
              fVar205 = pfVar3[1];
              fVar206 = pfVar3[2];
              fVar207 = pfVar3[3];
              fVar208 = pfVar3[4];
              fVar209 = pfVar3[5];
              fVar210 = pfVar3[6];
              in_register_0000155c = pfVar7[7] + fVar149;
              pfVar3 = (float *)(lVar247 + 0x80 + lVar243);
              fVar232 = *pfVar3;
              fVar233 = pfVar3[1];
              fVar234 = pfVar3[2];
              fVar235 = pfVar3[3];
              fVar236 = pfVar3[4];
              fVar237 = pfVar3[5];
              fVar238 = pfVar3[6];
              in_register_0000159c = pfVar3[7];
              in_register_0000139c =
                   in_register_000013dc + in_register_0000145c + pfVar7[7] + fVar274;
              pfVar3 = (float *)(lVar247 + 0xa0 + lVar243);
              fVar211 = *pfVar3;
              fVar212 = pfVar3[1];
              fVar213 = pfVar3[2];
              fVar214 = pfVar3[3];
              fVar215 = pfVar3[4];
              fVar216 = pfVar3[5];
              fVar217 = pfVar3[6];
              pfVar3 = (float *)((long)pfVar250 + lVar243);
              *pfVar3 = fVar164 * fVar225 + fVar150 * fVar185 + fVar157 * fVar193 +
                        fVar109 * fVar95 + fVar102 * fVar75 + fVar117 * fVar142 +
                        fVar54 * *pfVar5 + fVar280 + fVar25 * fVar61 + fVar32 * fVar68;
              pfVar3[1] = fVar165 * fVar226 + fVar151 * fVar186 + fVar158 * fVar194 +
                          fVar110 * fVar96 + fVar103 * fVar76 + fVar118 * fVar143 +
                          fVar55 * fVar82 + fVar281 + fVar26 * fVar62 + fVar33 * fVar69;
              pfVar3[2] = fVar166 * fVar227 + fVar152 * fVar187 + fVar159 * fVar195 +
                          fVar111 * fVar97 + fVar104 * fVar77 + fVar119 * fVar144 +
                          fVar56 * fVar83 + fVar282 + fVar27 * fVar63 + fVar34 * fVar70;
              pfVar3[3] = fVar167 * fVar228 + fVar266 * fVar188 + fVar160 * fVar196 +
                          fVar112 * fVar98 + fVar105 * fVar78 + fVar120 * fVar145 +
                          fVar57 * fVar84 + fVar283 + fVar28 * fVar64 + fVar35 * fVar71;
              pfVar3[4] = fVar168 * fVar229 + fVar153 * fVar189 + fVar161 * fVar197 +
                          fVar113 * fVar99 + fVar106 * fVar79 + fVar121 * fVar146 +
                          fVar58 * fVar85 + fVar284 + fVar29 * fVar65 + fVar36 * fVar72;
              pfVar3[5] = fVar169 * fVar230 + fVar154 * fVar190 + fVar162 * fVar198 +
                          fVar114 * fVar100 + fVar107 * fVar80 + fVar122 * fVar147 +
                          fVar59 * fVar86 + fVar285 + fVar30 * fVar66 + fVar37 * fVar73;
              pfVar3[6] = fVar170 * fVar231 + fVar155 * fVar191 + fVar163 * fVar199 +
                          fVar115 * fVar101 + fVar108 * fVar81 + fVar123 * fVar148 +
                          fVar60 * fVar87 + fVar286 + fVar31 * fVar67 + fVar38 * fVar74;
              pfVar3[7] = in_register_0000149c;
              pfVar5 = (float *)((long)pfVar250 + lVar243 + 0x20);
              *pfVar5 = fVar164 * fVar193 + fVar157 * fVar185 + fVar171 * fVar225 +
                        fVar109 * fVar75 + fVar117 * fVar95 + fVar124 * fVar142 +
                        fVar25 * fVar54 + fVar280 + fVar32 * fVar61 + fVar39 * fVar68;
              pfVar5[1] = fVar165 * fVar194 + fVar158 * fVar186 + fVar172 * fVar226 +
                          fVar110 * fVar76 + fVar118 * fVar96 + fVar125 * fVar143 +
                          fVar26 * fVar55 + fVar281 + fVar33 * fVar62 + fVar40 * fVar69;
              pfVar5[2] = fVar166 * fVar195 + fVar159 * fVar187 + fVar173 * fVar227 +
                          fVar111 * fVar77 + fVar119 * fVar97 + fVar126 * fVar144 +
                          fVar27 * fVar56 + fVar282 + fVar34 * fVar63 + fVar41 * fVar70;
              pfVar5[3] = fVar167 * fVar196 + fVar160 * fVar188 + fVar174 * fVar228 +
                          fVar112 * fVar78 + fVar120 * fVar98 + fVar268 * fVar145 +
                          fVar28 * fVar57 + fVar283 + fVar35 * fVar64 + fVar42 * fVar71;
              pfVar5[4] = fVar168 * fVar197 + fVar161 * fVar189 + fVar175 * fVar229 +
                          fVar113 * fVar79 + fVar121 * fVar99 + fVar270 * fVar146 +
                          fVar29 * fVar58 + fVar284 + fVar36 * fVar65 + fVar43 * fVar72;
              pfVar5[5] = fVar169 * fVar198 + fVar162 * fVar190 + fVar264 * fVar230 +
                          fVar114 * fVar80 + fVar122 * fVar100 + fVar127 * fVar147 +
                          fVar30 * fVar59 + fVar285 + fVar37 * fVar66 + fVar44 * fVar73;
              pfVar5[6] = fVar170 * fVar199 + fVar163 * fVar191 + fVar176 * fVar231 +
                          fVar115 * fVar81 + fVar123 * fVar101 + fVar128 * fVar148 +
                          fVar31 * fVar60 + fVar286 + fVar38 * fVar67 + fVar45 * fVar74;
              pfVar5[7] = in_register_0000135c;
              pfVar5 = (float *)((long)pfVar250 + lVar243 + 0x40);
              *pfVar5 = fVar171 * fVar193 + fVar164 * fVar185 + fVar225 * fVar177 +
                        fVar117 * fVar75 + fVar124 * fVar95 + fVar142 * fVar129 +
                        fVar32 * fVar54 + fVar280 + fVar39 * fVar61 + fVar47 * fVar68;
              pfVar5[1] = fVar172 * fVar194 + fVar165 * fVar186 + fVar226 * fVar178 +
                          fVar118 * fVar76 + fVar125 * fVar96 + fVar143 * fVar130 +
                          fVar33 * fVar55 + fVar281 + fVar40 * fVar62 + fVar48 * fVar69;
              pfVar5[2] = fVar173 * fVar195 + fVar166 * fVar187 + fVar227 * fVar179 +
                          fVar119 * fVar77 + fVar126 * fVar97 + fVar144 * fVar131 +
                          fVar34 * fVar56 + fVar282 + fVar41 * fVar63 + fVar49 * fVar70;
              pfVar5[3] = fVar174 * fVar196 + fVar167 * fVar188 + fVar228 * fVar180 +
                          fVar120 * fVar78 + fVar268 * fVar98 + fVar145 * fVar132 +
                          fVar35 * fVar57 + fVar283 + fVar42 * fVar64 + fVar50 * fVar71;
              pfVar5[4] = fVar175 * fVar197 + fVar168 * fVar189 + fVar229 * fVar181 +
                          fVar121 * fVar79 + fVar270 * fVar99 + fVar146 * fVar133 +
                          fVar36 * fVar58 + fVar284 + fVar43 * fVar65 + fVar51 * fVar72;
              pfVar5[5] = fVar264 * fVar198 + fVar169 * fVar190 + fVar230 * fVar182 +
                          fVar122 * fVar80 + fVar127 * fVar100 + fVar147 * fVar134 +
                          fVar37 * fVar59 + fVar285 + fVar44 * fVar66 + fVar52 * fVar73;
              pfVar5[6] = fVar176 * fVar199 + fVar170 * fVar191 + fVar231 * fVar183 +
                          fVar123 * fVar81 + fVar128 * fVar101 + fVar148 * fVar135 +
                          fVar38 * fVar60 + fVar286 + fVar45 * fVar67 + fVar53 * fVar74;
              pfVar5[7] = fVar272 + fVar156 + fVar184 + fVar255;
              pfVar5 = (float *)((long)pfVar250 + lVar243 + 0x60);
              *pfVar5 = fVar177 * fVar193 + fVar171 * fVar185 + fVar225 * fVar267 +
                        fVar129 * fVar95 + fVar124 * fVar75 + fVar278 * fVar142 +
                        fVar39 * fVar54 + fVar280 + fVar47 * fVar61 + fVar68 * fVar88;
              pfVar5[1] = fVar178 * fVar194 + fVar172 * fVar186 + fVar226 * fVar258 +
                          fVar130 * fVar96 + fVar125 * fVar76 + fVar136 * fVar143 +
                          fVar40 * fVar55 + fVar281 + fVar48 * fVar62 + fVar69 * fVar89;
              pfVar5[2] = fVar179 * fVar195 + fVar173 * fVar187 + fVar227 * fVar265 +
                          fVar131 * fVar97 + fVar126 * fVar77 + fVar137 * fVar144 +
                          fVar41 * fVar56 + fVar282 + fVar49 * fVar63 + fVar70 * fVar90;
              pfVar5[3] = fVar180 * fVar196 + fVar174 * fVar188 + fVar228 * fVar269 +
                          fVar132 * fVar98 + fVar268 * fVar78 + fVar138 * fVar145 +
                          fVar42 * fVar57 + fVar283 + fVar50 * fVar64 + fVar71 * fVar91;
              pfVar5[4] = fVar181 * fVar197 + fVar175 * fVar189 + fVar229 * fVar201 +
                          fVar133 * fVar99 + fVar270 * fVar79 + fVar139 * fVar146 +
                          fVar43 * fVar58 + fVar284 + fVar51 * fVar65 + fVar72 * fVar92;
              pfVar5[5] = fVar182 * fVar198 + fVar264 * fVar190 + fVar230 * fVar202 +
                          fVar134 * fVar100 + fVar127 * fVar80 + fVar140 * fVar147 +
                          fVar44 * fVar59 + fVar285 + fVar52 * fVar66 + fVar73 * fVar93;
              pfVar5[6] = fVar183 * fVar199 + fVar176 * fVar191 + fVar231 * fVar203 +
                          fVar135 * fVar101 + fVar128 * fVar81 + fVar141 * fVar148 +
                          fVar45 * fVar60 + fVar286 + fVar53 * fVar67 + fVar74 * fVar94;
              pfVar5[7] = in_register_0000141c;
              pfVar5 = (float *)((long)pfVar242 + lVar243);
              *pfVar5 = fVar185 * fVar204 + fVar46 * fVar193 + fVar260 * fVar225 +
                        fVar157 * fVar95 + fVar150 * fVar75 + fVar164 * fVar142 +
                        fVar102 * fVar54 + fVar280 + fVar109 * fVar61 + fVar117 * fVar68;
              pfVar5[1] = fVar186 * fVar205 + fVar253 * fVar194 + fVar263 * fVar226 +
                          fVar158 * fVar96 + fVar151 * fVar76 + fVar165 * fVar143 +
                          fVar103 * fVar55 + fVar281 + fVar110 * fVar62 + fVar118 * fVar69;
              pfVar5[2] = fVar187 * fVar206 + fVar254 * fVar195 + fVar271 * fVar227 +
                          fVar159 * fVar97 + fVar152 * fVar77 + fVar166 * fVar144 +
                          fVar104 * fVar56 + fVar282 + fVar111 * fVar63 + fVar119 * fVar70;
              pfVar5[3] = fVar188 * fVar207 + fVar256 * fVar196 + fVar273 * fVar228 +
                          fVar160 * fVar98 + fVar266 * fVar78 + fVar167 * fVar145 +
                          fVar105 * fVar57 + fVar283 + fVar112 * fVar64 + fVar120 * fVar71;
              pfVar5[4] = fVar189 * fVar208 + fVar257 * fVar197 + fVar276 * fVar229 +
                          fVar161 * fVar99 + fVar153 * fVar79 + fVar168 * fVar146 +
                          fVar106 * fVar58 + fVar284 + fVar113 * fVar65 + fVar121 * fVar72;
              pfVar5[5] = fVar190 * fVar209 + fVar259 * fVar198 + fVar277 * fVar230 +
                          fVar162 * fVar100 + fVar154 * fVar80 + fVar169 * fVar147 +
                          fVar107 * fVar59 + fVar285 + fVar114 * fVar66 + fVar122 * fVar73;
              pfVar5[6] = fVar191 * fVar210 + fVar261 * fVar199 + fVar279 * fVar231 +
                          fVar163 * fVar101 + fVar155 * fVar81 + fVar170 * fVar148 +
                          fVar108 * fVar60 + fVar286 + fVar115 * fVar67 + fVar123 * fVar74;
              pfVar5[7] = fVar149 + fVar262 + fVar200 + fVar274;
              pfVar5 = (float *)((long)pfVar242 + lVar243 + 0x20);
              *pfVar5 = fVar171 * fVar142 + fVar164 * fVar95 + fVar157 * fVar75 +
                        fVar117 * fVar61 + fVar124 * fVar68 + fVar109 * fVar54 + fVar280 +
                        fVar46 * fVar185 + fVar260 * fVar193 + fVar218 * fVar225;
              pfVar5[1] = fVar172 * fVar143 + fVar165 * fVar96 + fVar158 * fVar76 +
                          fVar118 * fVar62 + fVar125 * fVar69 + fVar110 * fVar55 + fVar281 +
                          fVar253 * fVar186 + fVar263 * fVar194 + fVar219 * fVar226;
              pfVar5[2] = fVar173 * fVar144 + fVar166 * fVar97 + fVar159 * fVar77 +
                          fVar119 * fVar63 + fVar126 * fVar70 + fVar111 * fVar56 + fVar282 +
                          fVar254 * fVar187 + fVar271 * fVar195 + fVar220 * fVar227;
              pfVar5[3] = fVar174 * fVar145 + fVar167 * fVar98 + fVar160 * fVar78 +
                          fVar120 * fVar64 + fVar268 * fVar71 + fVar112 * fVar57 + fVar283 +
                          fVar256 * fVar188 + fVar273 * fVar196 + fVar221 * fVar228;
              pfVar5[4] = fVar175 * fVar146 + fVar168 * fVar99 + fVar161 * fVar79 +
                          fVar121 * fVar65 + fVar270 * fVar72 + fVar113 * fVar58 + fVar284 +
                          fVar257 * fVar189 + fVar276 * fVar197 + fVar222 * fVar229;
              pfVar5[5] = fVar264 * fVar147 + fVar169 * fVar100 + fVar162 * fVar80 +
                          fVar122 * fVar66 + fVar127 * fVar73 + fVar114 * fVar59 + fVar285 +
                          fVar259 * fVar190 + fVar277 * fVar198 + fVar223 * fVar230;
              pfVar5[6] = fVar176 * fVar148 + fVar170 * fVar101 + fVar163 * fVar81 +
                          fVar123 * fVar67 + fVar128 * fVar74 + fVar115 * fVar60 + fVar286 +
                          fVar261 * fVar191 + fVar279 * fVar199 + fVar224 * fVar231;
              pfVar5[7] = fVar288 + fVar275 + fVar116 + fVar287 +
                          in_register_0000155c + fVar149 + fVar262;
              pfVar5 = (float *)((long)pfVar242 + lVar243 + 0x40);
              *pfVar5 = fVar164 * fVar75 + fVar171 * fVar95 + fVar142 * fVar177 +
                        fVar117 * fVar54 + fVar280 + fVar124 * fVar61 + fVar129 * fVar68 +
                        fVar232 * fVar225 + fVar260 * fVar185 + fVar218 * fVar193;
              pfVar5[1] = fVar165 * fVar76 + fVar172 * fVar96 + fVar143 * fVar178 +
                          fVar118 * fVar55 + fVar281 + fVar125 * fVar62 + fVar130 * fVar69 +
                          fVar233 * fVar226 + fVar263 * fVar186 + fVar219 * fVar194;
              pfVar5[2] = fVar166 * fVar77 + fVar173 * fVar97 + fVar144 * fVar179 +
                          fVar119 * fVar56 + fVar282 + fVar126 * fVar63 + fVar131 * fVar70 +
                          fVar234 * fVar227 + fVar271 * fVar187 + fVar220 * fVar195;
              pfVar5[3] = fVar167 * fVar78 + fVar174 * fVar98 + fVar145 * fVar180 +
                          fVar120 * fVar57 + fVar283 + fVar268 * fVar64 + fVar132 * fVar71 +
                          fVar235 * fVar228 + fVar273 * fVar188 + fVar221 * fVar196;
              pfVar5[4] = fVar168 * fVar79 + fVar175 * fVar99 + fVar146 * fVar181 +
                          fVar121 * fVar58 + fVar284 + fVar270 * fVar65 + fVar133 * fVar72 +
                          fVar236 * fVar229 + fVar276 * fVar189 + fVar222 * fVar197;
              pfVar5[5] = fVar169 * fVar80 + fVar264 * fVar100 + fVar147 * fVar182 +
                          fVar122 * fVar59 + fVar285 + fVar127 * fVar66 + fVar134 * fVar73 +
                          fVar237 * fVar230 + fVar277 * fVar190 + fVar223 * fVar198;
              pfVar5[6] = fVar170 * fVar81 + fVar176 * fVar101 + fVar148 * fVar183 +
                          fVar123 * fVar60 + fVar286 + fVar128 * fVar67 + fVar135 * fVar74 +
                          fVar238 * fVar231 + fVar279 * fVar191 + fVar224 * fVar199;
              pfVar5[7] = in_register_0000139c;
              pfVar5 = (float *)((long)pfVar242 + lVar243 + 0x60);
              *pfVar5 = fVar124 * fVar54 + fVar280 + fVar129 * fVar61 + fVar278 * fVar68 +
                        fVar142 * fVar267 + fVar171 * fVar75 + fVar177 * fVar95 +
                        fVar218 * fVar185 + fVar232 * fVar193 + fVar225 * fVar211;
              pfVar5[1] = fVar125 * fVar55 + fVar281 + fVar130 * fVar62 + fVar136 * fVar69 +
                          fVar143 * fVar258 + fVar172 * fVar76 + fVar178 * fVar96 +
                          fVar219 * fVar186 + fVar233 * fVar194 + fVar226 * fVar212;
              pfVar5[2] = fVar126 * fVar56 + fVar282 + fVar131 * fVar63 + fVar137 * fVar70 +
                          fVar144 * fVar265 + fVar173 * fVar77 + fVar179 * fVar97 +
                          fVar220 * fVar187 + fVar234 * fVar195 + fVar227 * fVar213;
              pfVar5[3] = fVar268 * fVar57 + fVar283 + fVar132 * fVar64 + fVar138 * fVar71 +
                          fVar145 * fVar269 + fVar174 * fVar78 + fVar180 * fVar98 +
                          fVar221 * fVar188 + fVar235 * fVar196 + fVar228 * fVar214;
              pfVar5[4] = fVar270 * fVar58 + fVar284 + fVar133 * fVar65 + fVar139 * fVar72 +
                          fVar146 * fVar201 + fVar175 * fVar79 + fVar181 * fVar99 +
                          fVar222 * fVar189 + fVar236 * fVar197 + fVar229 * fVar215;
              pfVar5[5] = fVar127 * fVar59 + fVar285 + fVar134 * fVar66 + fVar140 * fVar73 +
                          fVar147 * fVar202 + fVar264 * fVar80 + fVar182 * fVar100 +
                          fVar223 * fVar190 + fVar237 * fVar198 + fVar230 * fVar216;
              pfVar5[6] = fVar128 * fVar60 + fVar286 + fVar135 * fVar67 + fVar141 * fVar74 +
                          fVar148 * fVar203 + fVar176 * fVar81 + fVar183 * fVar101 +
                          fVar224 * fVar191 + fVar238 * fVar199 + fVar231 * fVar217;
              pfVar5[7] = in_register_000012dc + fVar192 + fVar200 + in_register_000013dc;
              lVar243 = lVar243 + 0x80;
              iVar248 = iVar248 + 4;
            } while (iVar248 < (int)uVar22);
            pfVar250 = (float *)((long)pfVar250 + lVar243);
            pfVar242 = (float *)((long)pfVar242 + lVar243);
            pfVar239 = (float *)((long)pfVar239 + lVar243);
            pfVar252 = (float *)((long)pfVar252 + lVar243);
            pfVar240 = (float *)((long)pfVar240 + lVar243);
            lVar247 = lVar247 + lVar243;
            uVar249 = uVar22 & 0xfffffffc;
          }
          if ((int)(uVar249 | 1) < (int)uVar22) {
            lVar243 = 0;
            uVar246 = uVar249;
            do {
              pfVar5 = (float *)((long)pfVar239 + lVar243 + 0x20);
              fVar25 = *pfVar5;
              fVar26 = pfVar5[1];
              fVar27 = pfVar5[2];
              fVar28 = pfVar5[3];
              fVar29 = pfVar5[4];
              fVar30 = pfVar5[5];
              fVar31 = pfVar5[6];
              fVar32 = pfVar5[7];
              pfVar5 = (float *)((long)pfVar239 + lVar243 + 0x40);
              fVar33 = *pfVar5;
              fVar34 = pfVar5[1];
              fVar35 = pfVar5[2];
              fVar36 = pfVar5[3];
              fVar37 = pfVar5[4];
              fVar38 = pfVar5[5];
              fVar39 = pfVar5[6];
              fVar40 = pfVar5[7];
              pfVar12 = (float *)((long)pvVar24 + lVar251);
              fVar41 = *pfVar12;
              fVar42 = pfVar12[1];
              fVar43 = pfVar12[2];
              fVar44 = pfVar12[3];
              fVar45 = pfVar12[4];
              fVar46 = pfVar12[5];
              fVar47 = pfVar12[6];
              pfVar4 = (float *)((long)pvVar24 + lVar251 + 0x20);
              fVar48 = *pfVar4;
              fVar49 = pfVar4[1];
              fVar50 = pfVar4[2];
              fVar51 = pfVar4[3];
              fVar52 = pfVar4[4];
              fVar53 = pfVar4[5];
              fVar54 = pfVar4[6];
              pfVar6 = (float *)((long)pvVar24 + lVar251 + 0x40);
              fVar55 = *pfVar6;
              fVar56 = pfVar6[1];
              fVar57 = pfVar6[2];
              fVar58 = pfVar6[3];
              fVar59 = pfVar6[4];
              fVar60 = pfVar6[5];
              fVar61 = pfVar6[6];
              pfVar5 = (float *)((long)pvVar24 + lVar251 + 0x60);
              fVar62 = *pfVar5;
              fVar63 = pfVar5[1];
              fVar64 = pfVar5[2];
              fVar65 = pfVar5[3];
              fVar66 = pfVar5[4];
              fVar67 = pfVar5[5];
              fVar68 = pfVar5[6];
              fVar69 = pfVar5[7];
              pfVar5 = (float *)((long)pfVar239 + lVar243);
              fVar70 = pfVar5[1];
              fVar71 = pfVar5[2];
              fVar72 = pfVar5[3];
              fVar73 = pfVar5[4];
              fVar74 = pfVar5[5];
              fVar75 = pfVar5[6];
              fVar267 = fVar287 + in_register_000012dc;
              pfVar3 = (float *)((long)pfVar239 + lVar243 + 0x60);
              fVar76 = *pfVar3;
              fVar77 = pfVar3[1];
              fVar78 = pfVar3[2];
              fVar79 = pfVar3[3];
              fVar80 = pfVar3[4];
              fVar81 = pfVar3[5];
              fVar82 = pfVar3[6];
              fVar268 = fVar287 + in_register_000013dc + in_register_0000141c + fVar40;
              pfVar3 = (float *)((long)pvVar24 + lVar251 + 0x80);
              fVar83 = *pfVar3;
              fVar84 = pfVar3[1];
              fVar85 = pfVar3[2];
              fVar86 = pfVar3[3];
              fVar87 = pfVar3[4];
              fVar88 = pfVar3[5];
              fVar89 = pfVar3[6];
              fVar90 = pfVar3[7];
              pfVar3 = (float *)((long)pvVar24 + lVar251 + 0xa0);
              fVar91 = *pfVar3;
              fVar92 = pfVar3[1];
              fVar93 = pfVar3[2];
              fVar94 = pfVar3[3];
              fVar95 = pfVar3[4];
              fVar96 = pfVar3[5];
              fVar97 = pfVar3[6];
              fVar98 = pfVar3[7];
              pfVar3 = (float *)((long)pfVar252 + lVar243);
              fVar99 = *pfVar3;
              fVar100 = pfVar3[1];
              fVar101 = pfVar3[2];
              fVar102 = pfVar3[3];
              fVar103 = pfVar3[4];
              fVar104 = pfVar3[5];
              fVar105 = pfVar3[6];
              pfVar7 = (float *)((long)pfVar252 + lVar243 + 0x20);
              fVar106 = *pfVar7;
              fVar107 = pfVar7[1];
              fVar108 = pfVar7[2];
              fVar109 = pfVar7[3];
              fVar110 = pfVar7[4];
              fVar111 = pfVar7[5];
              fVar112 = pfVar7[6];
              pfVar8 = (float *)((long)pfVar252 + lVar243 + 0x40);
              fVar113 = *pfVar8;
              fVar114 = pfVar8[1];
              fVar115 = pfVar8[2];
              fVar116 = pfVar8[3];
              fVar117 = pfVar8[4];
              fVar118 = pfVar8[5];
              fVar119 = pfVar8[6];
              pfVar8 = (float *)((long)pfVar252 + lVar243 + 0x60);
              fVar120 = *pfVar8;
              fVar121 = pfVar8[1];
              fVar122 = pfVar8[2];
              fVar123 = pfVar8[3];
              fVar124 = pfVar8[4];
              fVar125 = pfVar8[5];
              fVar126 = pfVar8[6];
              fVar265 = in_register_0000151c + in_register_0000159c + pfVar4[7];
              fVar266 = fVar268 + in_register_0000155c + in_register_0000159c + fVar265;
              fVar269 = pfVar3[7] + fVar287 + pfVar7[7] + fVar268;
              in_register_0000141c = fVar287 + pfVar12[7] + in_register_0000159c + pfVar6[7];
              pfVar3 = (float *)((long)pvVar24 + lVar251 + 0xc0);
              fVar268 = *pfVar3;
              fVar270 = pfVar3[1];
              fVar127 = pfVar3[2];
              fVar128 = pfVar3[3];
              fVar129 = pfVar3[4];
              fVar130 = pfVar3[5];
              fVar131 = pfVar3[6];
              in_register_0000135c = pfVar3[7];
              pfVar3 = (float *)((long)pvVar24 + lVar251 + 0xe0);
              fVar132 = *pfVar3;
              fVar133 = pfVar3[1];
              fVar134 = pfVar3[2];
              fVar135 = pfVar3[3];
              fVar278 = pfVar3[4];
              fVar136 = pfVar3[5];
              fVar137 = pfVar3[6];
              fVar138 = pfVar3[7];
              pfVar3 = (float *)((long)pfVar240 + lVar243);
              fVar139 = *pfVar3;
              fVar140 = pfVar3[1];
              fVar141 = pfVar3[2];
              fVar142 = pfVar3[3];
              fVar143 = pfVar3[4];
              fVar144 = pfVar3[5];
              fVar145 = pfVar3[6];
              pfVar4 = (float *)((long)pfVar240 + lVar243 + 0x20);
              fVar146 = *pfVar4;
              fVar147 = pfVar4[1];
              fVar148 = pfVar4[2];
              fVar149 = pfVar4[3];
              fVar150 = pfVar4[4];
              fVar151 = pfVar4[5];
              fVar152 = pfVar4[6];
              pfVar6 = (float *)((long)pfVar240 + lVar243 + 0x40);
              fVar187 = *pfVar6;
              fVar188 = pfVar6[1];
              fVar189 = pfVar6[2];
              fVar190 = pfVar6[3];
              fVar191 = pfVar6[4];
              fVar192 = pfVar6[5];
              fVar193 = pfVar6[6];
              in_register_000014dc = pfVar6[7];
              in_register_0000155c =
                   in_register_0000155c + in_register_0000159c + in_register_0000159c;
              in_register_0000145c = pfVar3[7] + pfVar4[7];
              pfVar3 = (float *)((long)pvVar24 + lVar251 + 0x100);
              fVar180 = *pfVar3;
              fVar181 = pfVar3[1];
              fVar182 = pfVar3[2];
              fVar183 = pfVar3[3];
              fVar184 = pfVar3[4];
              fVar185 = pfVar3[5];
              fVar186 = pfVar3[6];
              in_register_0000149c = pfVar3[7];
              fVar258 = in_register_0000151c + in_register_0000159c + in_register_0000159c + fVar90;
              pfVar3 = (float *)((long)pfVar240 + lVar243 + 0x60);
              fVar194 = *pfVar3;
              fVar195 = pfVar3[1];
              fVar196 = pfVar3[2];
              fVar197 = pfVar3[3];
              fVar198 = pfVar3[4];
              fVar199 = pfVar3[5];
              fVar200 = pfVar3[6];
              in_register_0000151c = pfVar3[7];
              in_register_000012dc = fVar266 + in_register_0000155c + fVar258;
              in_register_0000139c = fVar269 + in_register_0000145c + fVar266;
              pfVar3 = (float *)(lVar247 + 0x20 + lVar243);
              fVar266 = *pfVar3;
              fVar153 = pfVar3[1];
              fVar154 = pfVar3[2];
              fVar155 = pfVar3[3];
              fVar156 = pfVar3[4];
              fVar157 = pfVar3[5];
              fVar158 = pfVar3[6];
              fVar159 = pfVar3[7];
              pfVar3 = (float *)(lVar247 + lVar243);
              fVar160 = *pfVar3;
              fVar161 = pfVar3[1];
              fVar162 = pfVar3[2];
              fVar163 = pfVar3[3];
              fVar164 = pfVar3[4];
              fVar165 = pfVar3[5];
              fVar166 = pfVar3[6];
              pfVar3 = (float *)(lVar247 + 0x40 + lVar243);
              fVar174 = *pfVar3;
              fVar175 = pfVar3[1];
              fVar264 = pfVar3[2];
              fVar176 = pfVar3[3];
              fVar177 = pfVar3[4];
              fVar178 = pfVar3[5];
              fVar179 = pfVar3[6];
              in_register_000013dc = pfVar3[7];
              pfVar3 = (float *)(lVar247 + 0x60 + lVar243);
              fVar167 = *pfVar3;
              fVar168 = pfVar3[1];
              fVar169 = pfVar3[2];
              fVar170 = pfVar3[3];
              fVar171 = pfVar3[4];
              fVar172 = pfVar3[5];
              fVar173 = pfVar3[6];
              pfVar3 = (float *)((long)pfVar250 + lVar243);
              *pfVar3 = fVar280 + fVar41 * *pfVar5 + fVar25 * fVar48 + fVar33 * fVar55 +
                        fVar99 * fVar62 + fVar106 * fVar83 + fVar113 * fVar91 +
                        fVar139 * fVar268 + fVar146 * fVar132 + fVar187 * fVar180;
              pfVar3[1] = fVar281 + fVar42 * fVar70 + fVar26 * fVar49 + fVar34 * fVar56 +
                          fVar100 * fVar63 + fVar107 * fVar84 + fVar114 * fVar92 +
                          fVar140 * fVar270 + fVar147 * fVar133 + fVar188 * fVar181;
              pfVar3[2] = fVar282 + fVar43 * fVar71 + fVar27 * fVar50 + fVar35 * fVar57 +
                          fVar101 * fVar64 + fVar108 * fVar85 + fVar115 * fVar93 +
                          fVar141 * fVar127 + fVar148 * fVar134 + fVar189 * fVar182;
              pfVar3[3] = fVar283 + fVar44 * fVar72 + fVar28 * fVar51 + fVar36 * fVar58 +
                          fVar102 * fVar65 + fVar109 * fVar86 + fVar116 * fVar94 +
                          fVar142 * fVar128 + fVar149 * fVar135 + fVar190 * fVar183;
              pfVar3[4] = fVar284 + fVar45 * fVar73 + fVar29 * fVar52 + fVar37 * fVar59 +
                          fVar103 * fVar66 + fVar110 * fVar87 + fVar117 * fVar95 +
                          fVar143 * fVar129 + fVar150 * fVar278 + fVar191 * fVar184;
              pfVar3[5] = fVar285 + fVar46 * fVar74 + fVar30 * fVar53 + fVar38 * fVar60 +
                          fVar104 * fVar67 + fVar111 * fVar88 + fVar118 * fVar96 +
                          fVar144 * fVar130 + fVar151 * fVar136 + fVar192 * fVar185;
              pfVar3[6] = fVar286 + fVar47 * fVar75 + fVar31 * fVar54 + fVar39 * fVar61 +
                          fVar105 * fVar68 + fVar112 * fVar89 + fVar119 * fVar97 +
                          fVar145 * fVar131 + fVar152 * fVar137 + fVar193 * fVar186;
              pfVar3[7] = fVar267 + fVar32 + fVar40 + fVar265 + fVar258;
              pfVar5 = (float *)((long)pfVar250 + lVar243 + 0x20);
              *pfVar5 = fVar280 + fVar25 * fVar41 + fVar33 * fVar48 + fVar55 * fVar76 +
                        fVar106 * fVar62 + fVar113 * fVar83 + fVar120 * fVar91 +
                        fVar146 * fVar268 + fVar187 * fVar132 + fVar194 * fVar180;
              pfVar5[1] = fVar281 + fVar26 * fVar42 + fVar34 * fVar49 + fVar56 * fVar77 +
                          fVar107 * fVar63 + fVar114 * fVar84 + fVar121 * fVar92 +
                          fVar147 * fVar270 + fVar188 * fVar133 + fVar195 * fVar181;
              pfVar5[2] = fVar282 + fVar27 * fVar43 + fVar35 * fVar50 + fVar57 * fVar78 +
                          fVar108 * fVar64 + fVar115 * fVar85 + fVar122 * fVar93 +
                          fVar148 * fVar127 + fVar189 * fVar134 + fVar196 * fVar182;
              pfVar5[3] = fVar283 + fVar28 * fVar44 + fVar36 * fVar51 + fVar58 * fVar79 +
                          fVar109 * fVar65 + fVar116 * fVar86 + fVar123 * fVar94 +
                          fVar149 * fVar128 + fVar190 * fVar135 + fVar197 * fVar183;
              pfVar5[4] = fVar284 + fVar29 * fVar45 + fVar37 * fVar52 + fVar59 * fVar80 +
                          fVar110 * fVar66 + fVar117 * fVar87 + fVar124 * fVar95 +
                          fVar150 * fVar129 + fVar191 * fVar278 + fVar198 * fVar184;
              pfVar5[5] = fVar285 + fVar30 * fVar46 + fVar38 * fVar53 + fVar60 * fVar81 +
                          fVar111 * fVar67 + fVar118 * fVar88 + fVar125 * fVar96 +
                          fVar151 * fVar130 + fVar192 * fVar136 + fVar199 * fVar185;
              pfVar5[6] = fVar286 + fVar31 * fVar47 + fVar39 * fVar54 + fVar61 * fVar82 +
                          fVar112 * fVar68 + fVar119 * fVar89 + fVar126 * fVar97 +
                          fVar152 * fVar131 + fVar193 * fVar137 + fVar200 * fVar186;
              pfVar5[7] = in_register_000012dc;
              pfVar5 = (float *)((long)pfVar242 + lVar243);
              *pfVar5 = fVar99 * fVar41 + fVar280 + fVar106 * fVar48 + fVar113 * fVar55 +
                        fVar139 * fVar62 + fVar146 * fVar83 + fVar187 * fVar91 +
                        fVar268 * fVar160 + fVar266 * fVar132 + fVar180 * fVar174;
              pfVar5[1] = fVar100 * fVar42 + fVar281 + fVar107 * fVar49 + fVar114 * fVar56 +
                          fVar140 * fVar63 + fVar147 * fVar84 + fVar188 * fVar92 +
                          fVar270 * fVar161 + fVar153 * fVar133 + fVar181 * fVar175;
              pfVar5[2] = fVar101 * fVar43 + fVar282 + fVar108 * fVar50 + fVar115 * fVar57 +
                          fVar141 * fVar64 + fVar148 * fVar85 + fVar189 * fVar93 +
                          fVar127 * fVar162 + fVar154 * fVar134 + fVar182 * fVar264;
              pfVar5[3] = fVar102 * fVar44 + fVar283 + fVar109 * fVar51 + fVar116 * fVar58 +
                          fVar142 * fVar65 + fVar149 * fVar86 + fVar190 * fVar94 +
                          fVar128 * fVar163 + fVar155 * fVar135 + fVar183 * fVar176;
              pfVar5[4] = fVar103 * fVar45 + fVar284 + fVar110 * fVar52 + fVar117 * fVar59 +
                          fVar143 * fVar66 + fVar150 * fVar87 + fVar191 * fVar95 +
                          fVar129 * fVar164 + fVar156 * fVar278 + fVar184 * fVar177;
              pfVar5[5] = fVar104 * fVar46 + fVar285 + fVar111 * fVar53 + fVar118 * fVar60 +
                          fVar144 * fVar67 + fVar151 * fVar88 + fVar192 * fVar96 +
                          fVar130 * fVar165 + fVar157 * fVar136 + fVar185 * fVar178;
              pfVar5[6] = fVar105 * fVar47 + fVar286 + fVar112 * fVar54 + fVar119 * fVar61 +
                          fVar145 * fVar68 + fVar152 * fVar89 + fVar193 * fVar97 +
                          fVar131 * fVar166 + fVar158 * fVar137 + fVar186 * fVar179;
              pfVar5[7] = in_register_0000139c + fVar269 + fVar159 + in_register_0000135c;
              pfVar5 = (float *)((long)pfVar242 + lVar243 + 0x20);
              *pfVar5 = fVar280 + fVar106 * fVar41 + fVar113 * fVar48 + fVar120 * fVar55 +
                        fVar146 * fVar62 + fVar187 * fVar83 + fVar194 * fVar91 +
                        fVar266 * fVar268 + fVar174 * fVar132 + fVar180 * fVar167;
              pfVar5[1] = fVar281 + fVar107 * fVar42 + fVar114 * fVar49 + fVar121 * fVar56 +
                          fVar147 * fVar63 + fVar188 * fVar84 + fVar195 * fVar92 +
                          fVar153 * fVar270 + fVar175 * fVar133 + fVar181 * fVar168;
              pfVar5[2] = fVar282 + fVar108 * fVar43 + fVar115 * fVar50 + fVar122 * fVar57 +
                          fVar148 * fVar64 + fVar189 * fVar85 + fVar196 * fVar93 +
                          fVar154 * fVar127 + fVar264 * fVar134 + fVar182 * fVar169;
              pfVar5[3] = fVar283 + fVar109 * fVar44 + fVar116 * fVar51 + fVar123 * fVar58 +
                          fVar149 * fVar65 + fVar190 * fVar86 + fVar197 * fVar94 +
                          fVar155 * fVar128 + fVar176 * fVar135 + fVar183 * fVar170;
              pfVar5[4] = fVar284 + fVar110 * fVar45 + fVar117 * fVar52 + fVar124 * fVar59 +
                          fVar150 * fVar66 + fVar191 * fVar87 + fVar198 * fVar95 +
                          fVar156 * fVar129 + fVar177 * fVar278 + fVar184 * fVar171;
              pfVar5[5] = fVar285 + fVar111 * fVar46 + fVar118 * fVar53 + fVar125 * fVar60 +
                          fVar151 * fVar67 + fVar192 * fVar88 + fVar199 * fVar96 +
                          fVar157 * fVar130 + fVar178 * fVar136 + fVar185 * fVar172;
              pfVar5[6] = fVar286 + fVar112 * fVar47 + fVar119 * fVar54 + fVar126 * fVar61 +
                          fVar152 * fVar68 + fVar193 * fVar89 + fVar200 * fVar97 +
                          fVar158 * fVar131 + fVar179 * fVar137 + fVar186 * fVar173;
              pfVar5[7] = in_register_0000141c + fVar69 + fVar90 + fVar98 +
                          in_register_0000135c + fVar138 + in_register_0000135c;
              uVar249 = uVar246 + 2;
              lVar243 = lVar243 + 0x40;
              iVar248 = uVar246 + 3;
              uVar246 = uVar249;
            } while (iVar248 < (int)uVar22);
            pfVar250 = (float *)((long)pfVar250 + lVar243);
            pfVar242 = (float *)((long)pfVar242 + lVar243);
            pfVar239 = (float *)((long)pfVar239 + lVar243);
            pfVar252 = (float *)((long)pfVar252 + lVar243);
            pfVar240 = (float *)((long)pfVar240 + lVar243);
            lVar247 = lVar247 + lVar243;
          }
          if ((int)uVar249 < (int)uVar22) {
            iVar248 = uVar22 - uVar249;
            lVar243 = 0;
            do {
              pfVar5 = (float *)((long)pvVar24 + lVar251);
              fVar25 = *pfVar5;
              fVar26 = pfVar5[1];
              fVar27 = pfVar5[2];
              fVar28 = pfVar5[3];
              fVar29 = pfVar5[4];
              fVar30 = pfVar5[5];
              fVar31 = pfVar5[6];
              fVar32 = pfVar5[7];
              pfVar5 = (float *)((long)pvVar24 + lVar251 + 0x20);
              fVar33 = *pfVar5;
              fVar34 = pfVar5[1];
              fVar35 = pfVar5[2];
              fVar36 = pfVar5[3];
              fVar37 = pfVar5[4];
              fVar38 = pfVar5[5];
              fVar39 = pfVar5[6];
              fVar40 = pfVar5[7];
              pfVar5 = (float *)((long)pvVar24 + lVar251 + 0x40);
              fVar41 = *pfVar5;
              fVar42 = pfVar5[1];
              fVar43 = pfVar5[2];
              fVar44 = pfVar5[3];
              fVar45 = pfVar5[4];
              fVar46 = pfVar5[5];
              fVar47 = pfVar5[6];
              fVar48 = pfVar5[7];
              pfVar5 = (float *)((long)pfVar239 + lVar243);
              fVar49 = pfVar5[1];
              fVar50 = pfVar5[2];
              fVar51 = pfVar5[3];
              fVar52 = pfVar5[4];
              fVar53 = pfVar5[5];
              fVar54 = pfVar5[6];
              pfVar3 = (float *)((long)pvVar24 + lVar251 + 0x60);
              fVar55 = *pfVar3;
              fVar56 = pfVar3[1];
              fVar57 = pfVar3[2];
              fVar58 = pfVar3[3];
              fVar59 = pfVar3[4];
              fVar60 = pfVar3[5];
              fVar61 = pfVar3[6];
              fVar62 = pfVar3[7];
              pfVar4 = (float *)((long)pfVar239 + lVar243 + 0x20);
              fVar63 = pfVar4[1];
              fVar64 = pfVar4[2];
              fVar65 = pfVar4[3];
              fVar66 = pfVar4[4];
              fVar67 = pfVar4[5];
              fVar68 = pfVar4[6];
              pfVar6 = (float *)((long)pfVar239 + lVar243 + 0x40);
              fVar69 = pfVar6[1];
              fVar70 = pfVar6[2];
              fVar71 = pfVar6[3];
              fVar72 = pfVar6[4];
              fVar73 = pfVar6[5];
              fVar74 = pfVar6[6];
              fVar268 = in_register_0000135c + in_register_0000139c;
              pfVar3 = (float *)((long)pvVar24 + lVar251 + 0x80);
              fVar75 = *pfVar3;
              fVar76 = pfVar3[1];
              fVar77 = pfVar3[2];
              fVar78 = pfVar3[3];
              fVar79 = pfVar3[4];
              fVar80 = pfVar3[5];
              fVar81 = pfVar3[6];
              fVar82 = pfVar3[7];
              pfVar3 = (float *)((long)pvVar24 + lVar251 + 0xa0);
              fVar145 = *pfVar3;
              fVar146 = pfVar3[1];
              fVar147 = pfVar3[2];
              fVar148 = pfVar3[3];
              fVar149 = pfVar3[4];
              fVar150 = pfVar3[5];
              fVar151 = pfVar3[6];
              in_register_0000139c = pfVar3[7];
              pfVar3 = (float *)((long)pfVar252 + lVar243);
              fVar83 = *pfVar3;
              fVar84 = pfVar3[1];
              fVar85 = pfVar3[2];
              fVar86 = pfVar3[3];
              fVar87 = pfVar3[4];
              fVar88 = pfVar3[5];
              fVar89 = pfVar3[6];
              pfVar7 = (float *)((long)pfVar252 + lVar243 + 0x20);
              fVar90 = *pfVar7;
              fVar91 = pfVar7[1];
              fVar92 = pfVar7[2];
              fVar93 = pfVar7[3];
              fVar94 = pfVar7[4];
              fVar95 = pfVar7[5];
              fVar96 = pfVar7[6];
              pfVar8 = (float *)((long)pfVar252 + lVar243 + 0x40);
              fVar97 = *pfVar8;
              fVar98 = pfVar8[1];
              fVar99 = pfVar8[2];
              fVar100 = pfVar8[3];
              fVar101 = pfVar8[4];
              fVar102 = pfVar8[5];
              fVar103 = pfVar8[6];
              fVar270 = in_register_0000149c + pfVar3[7];
              pfVar3 = (float *)((long)pvVar24 + lVar251 + 0xc0);
              fVar104 = *pfVar3;
              fVar105 = pfVar3[1];
              fVar106 = pfVar3[2];
              fVar107 = pfVar3[3];
              fVar108 = pfVar3[4];
              fVar109 = pfVar3[5];
              fVar110 = pfVar3[6];
              fVar111 = pfVar3[7];
              pfVar3 = (float *)((long)pvVar24 + lVar251 + 0xe0);
              fVar112 = *pfVar3;
              fVar113 = pfVar3[1];
              fVar114 = pfVar3[2];
              fVar115 = pfVar3[3];
              fVar116 = pfVar3[4];
              fVar117 = pfVar3[5];
              fVar118 = pfVar3[6];
              fVar119 = pfVar3[7];
              pfVar3 = (float *)((long)pvVar24 + lVar251 + 0x100);
              fVar152 = *pfVar3;
              fVar266 = pfVar3[1];
              fVar153 = pfVar3[2];
              fVar154 = pfVar3[3];
              fVar155 = pfVar3[4];
              fVar156 = pfVar3[5];
              fVar157 = pfVar3[6];
              in_register_000013dc = pfVar3[7];
              pfVar3 = (float *)((long)pfVar240 + lVar243);
              fVar120 = *pfVar3;
              fVar121 = pfVar3[1];
              fVar122 = pfVar3[2];
              fVar123 = pfVar3[3];
              fVar124 = pfVar3[4];
              fVar125 = pfVar3[5];
              fVar126 = pfVar3[6];
              pfVar8 = (float *)((long)pfVar240 + lVar243 + 0x20);
              fVar158 = *pfVar8;
              fVar159 = pfVar8[1];
              fVar160 = pfVar8[2];
              fVar161 = pfVar8[3];
              fVar162 = pfVar8[4];
              fVar163 = pfVar8[5];
              fVar164 = pfVar8[6];
              in_register_0000145c = pfVar8[7];
              pfVar8 = (float *)((long)pfVar240 + lVar243 + 0x40);
              fVar165 = *pfVar8;
              fVar166 = pfVar8[1];
              fVar167 = pfVar8[2];
              fVar168 = pfVar8[3];
              fVar169 = pfVar8[4];
              fVar170 = pfVar8[5];
              fVar171 = pfVar8[6];
              in_register_0000149c = pfVar8[7];
              in_register_0000141c = in_register_000014dc + pfVar3[7];
              in_register_0000135c = in_register_0000141c + fVar82;
              in_register_000012dc =
                   fVar287 + in_register_000012dc + fVar268 + pfVar7[7] + fVar270 +
                   in_register_0000135c;
              pfVar3 = (float *)(lVar247 + lVar243);
              fVar268 = *pfVar3;
              fVar270 = pfVar3[1];
              fVar127 = pfVar3[2];
              fVar128 = pfVar3[3];
              fVar129 = pfVar3[4];
              fVar130 = pfVar3[5];
              fVar131 = pfVar3[6];
              pfVar3 = (float *)(lVar247 + 0x20 + lVar243);
              fVar132 = *pfVar3;
              fVar133 = pfVar3[1];
              fVar134 = pfVar3[2];
              fVar135 = pfVar3[3];
              fVar278 = pfVar3[4];
              fVar136 = pfVar3[5];
              fVar137 = pfVar3[6];
              pfVar3 = (float *)(lVar247 + 0x40 + lVar243);
              fVar138 = *pfVar3;
              fVar139 = pfVar3[1];
              fVar140 = pfVar3[2];
              fVar141 = pfVar3[3];
              fVar142 = pfVar3[4];
              fVar143 = pfVar3[5];
              fVar144 = pfVar3[6];
              pfVar3 = (float *)((long)pfVar250 + lVar243);
              *pfVar3 = fVar280 + fVar25 * *pfVar5 + fVar33 * *pfVar4 + fVar41 * *pfVar6 +
                        fVar97 * fVar145 + fVar83 * fVar55 + fVar90 * fVar75 +
                        fVar120 * fVar104 + fVar158 * fVar112 + fVar165 * fVar152;
              pfVar3[1] = fVar281 + fVar26 * fVar49 + fVar34 * fVar63 + fVar42 * fVar69 +
                          fVar98 * fVar146 + fVar84 * fVar56 + fVar91 * fVar76 +
                          fVar121 * fVar105 + fVar159 * fVar113 + fVar166 * fVar266;
              pfVar3[2] = fVar282 + fVar27 * fVar50 + fVar35 * fVar64 + fVar43 * fVar70 +
                          fVar99 * fVar147 + fVar85 * fVar57 + fVar92 * fVar77 +
                          fVar122 * fVar106 + fVar160 * fVar114 + fVar167 * fVar153;
              pfVar3[3] = fVar283 + fVar28 * fVar51 + fVar36 * fVar65 + fVar44 * fVar71 +
                          fVar100 * fVar148 + fVar86 * fVar58 + fVar93 * fVar78 +
                          fVar123 * fVar107 + fVar161 * fVar115 + fVar168 * fVar154;
              pfVar3[4] = fVar284 + fVar29 * fVar52 + fVar37 * fVar66 + fVar45 * fVar72 +
                          fVar101 * fVar149 + fVar87 * fVar59 + fVar94 * fVar79 +
                          fVar124 * fVar108 + fVar162 * fVar116 + fVar169 * fVar155;
              pfVar3[5] = fVar285 + fVar30 * fVar53 + fVar38 * fVar67 + fVar46 * fVar73 +
                          fVar102 * fVar150 + fVar88 * fVar60 + fVar95 * fVar80 +
                          fVar125 * fVar109 + fVar163 * fVar117 + fVar170 * fVar156;
              pfVar3[6] = fVar286 + fVar31 * fVar54 + fVar39 * fVar68 + fVar47 * fVar74 +
                          fVar103 * fVar151 + fVar89 * fVar61 + fVar96 * fVar81 +
                          fVar126 * fVar110 + fVar164 * fVar118 + fVar171 * fVar157;
              pfVar3[7] = in_register_000012dc;
              pfVar5 = (float *)((long)pfVar242 + lVar243);
              *pfVar5 = fVar280 + fVar83 * fVar25 + fVar90 * fVar33 + fVar97 * fVar41 +
                        fVar120 * fVar55 + fVar158 * fVar75 + fVar165 * fVar145 +
                        fVar104 * fVar268 + fVar112 * fVar132 + fVar152 * fVar138;
              pfVar5[1] = fVar281 + fVar84 * fVar26 + fVar91 * fVar34 + fVar98 * fVar42 +
                          fVar121 * fVar56 + fVar159 * fVar76 + fVar166 * fVar146 +
                          fVar105 * fVar270 + fVar113 * fVar133 + fVar266 * fVar139;
              pfVar5[2] = fVar282 + fVar85 * fVar27 + fVar92 * fVar35 + fVar99 * fVar43 +
                          fVar122 * fVar57 + fVar160 * fVar77 + fVar167 * fVar147 +
                          fVar106 * fVar127 + fVar114 * fVar134 + fVar153 * fVar140;
              pfVar5[3] = fVar283 + fVar86 * fVar28 + fVar93 * fVar36 + fVar100 * fVar44 +
                          fVar123 * fVar58 + fVar161 * fVar78 + fVar168 * fVar148 +
                          fVar107 * fVar128 + fVar115 * fVar135 + fVar154 * fVar141;
              pfVar5[4] = fVar284 + fVar87 * fVar29 + fVar94 * fVar37 + fVar101 * fVar45 +
                          fVar124 * fVar59 + fVar162 * fVar79 + fVar169 * fVar149 +
                          fVar108 * fVar129 + fVar116 * fVar278 + fVar155 * fVar142;
              pfVar5[5] = fVar285 + fVar88 * fVar30 + fVar95 * fVar38 + fVar102 * fVar46 +
                          fVar125 * fVar60 + fVar163 * fVar80 + fVar170 * fVar150 +
                          fVar109 * fVar130 + fVar117 * fVar136 + fVar156 * fVar143;
              pfVar5[6] = fVar286 + fVar89 * fVar31 + fVar96 * fVar39 + fVar103 * fVar47 +
                          fVar126 * fVar61 + fVar164 * fVar81 + fVar171 * fVar151 +
                          fVar110 * fVar131 + fVar118 * fVar137 + fVar157 * fVar144;
              pfVar5[7] = fVar287 + fVar32 + fVar40 + fVar48 +
                          fVar62 + fVar82 + in_register_0000135c + fVar111 + fVar119 + fVar119;
              lVar243 = lVar243 + 0x20;
              iVar248 = iVar248 + -1;
            } while (iVar248 != 0);
            pfVar250 = (float *)((long)pfVar250 + lVar243);
            pfVar242 = (float *)((long)pfVar242 + lVar243);
            pfVar239 = (float *)((long)pfVar239 + lVar243);
            pfVar252 = (float *)((long)pfVar252 + lVar243);
            pfVar240 = (float *)((long)pfVar240 + lVar243);
            lVar247 = lVar247 + lVar243;
          }
          pfVar239 = pfVar239 + lVar2;
          pfVar252 = pfVar252 + lVar2;
          pfVar240 = pfVar240 + lVar2;
          lVar247 = lVar247 + lVar2 * 4;
          pfVar250 = pfVar250 + (long)(int)uVar22 * 8;
          pfVar242 = pfVar242 + (long)(int)uVar22 * 8;
          iVar248 = iVar241 + 3;
          uVar249 = uVar23 & 0xfffffffe;
          iVar241 = iVar241 + 2;
        } while (iVar248 < (int)uVar23);
      }
      if ((int)uVar249 < (int)uVar23) {
        do {
          uVar246 = 0;
          if (3 < (int)uVar22) {
            iVar241 = 3;
            do {
              fVar25 = pfVar239[8];
              fVar26 = pfVar239[9];
              fVar27 = pfVar239[10];
              fVar28 = pfVar239[0xb];
              fVar29 = pfVar239[0xc];
              fVar30 = pfVar239[0xd];
              fVar31 = pfVar239[0xe];
              pfVar4 = pfVar239 + 0xf;
              fVar32 = pfVar239[0x10];
              fVar33 = pfVar239[0x11];
              fVar34 = pfVar239[0x12];
              fVar35 = pfVar239[0x13];
              fVar36 = pfVar239[0x14];
              fVar37 = pfVar239[0x15];
              fVar38 = pfVar239[0x16];
              pfVar6 = pfVar239 + 0x17;
              fVar39 = pfVar239[0x18];
              fVar40 = pfVar239[0x19];
              fVar41 = pfVar239[0x1a];
              fVar42 = pfVar239[0x1b];
              fVar43 = pfVar239[0x1c];
              fVar44 = pfVar239[0x1d];
              fVar45 = pfVar239[0x1e];
              pfVar7 = pfVar239 + 0x1f;
              pfVar3 = (float *)((long)pvVar24 + lVar251);
              fVar46 = *pfVar3;
              fVar47 = pfVar3[1];
              fVar48 = pfVar3[2];
              fVar49 = pfVar3[3];
              fVar50 = pfVar3[4];
              fVar51 = pfVar3[5];
              fVar52 = pfVar3[6];
              pfVar242 = (float *)((long)pvVar24 + lVar251 + 0x40);
              fVar53 = *pfVar242;
              fVar54 = pfVar242[1];
              fVar55 = pfVar242[2];
              fVar56 = pfVar242[3];
              fVar57 = pfVar242[4];
              fVar58 = pfVar242[5];
              fVar59 = pfVar242[6];
              fVar60 = pfVar242[7];
              fVar61 = *pfVar239;
              fVar62 = pfVar239[1];
              fVar63 = pfVar239[2];
              fVar64 = pfVar239[3];
              fVar65 = pfVar239[4];
              fVar66 = pfVar239[5];
              fVar67 = pfVar239[6];
              fVar68 = pfVar239[0x28];
              fVar69 = pfVar239[0x29];
              fVar70 = pfVar239[0x2a];
              fVar71 = pfVar239[0x2b];
              fVar72 = pfVar239[0x2c];
              fVar73 = pfVar239[0x2d];
              fVar74 = pfVar239[0x2e];
              fVar75 = pfVar239[0x20];
              fVar76 = pfVar239[0x21];
              fVar77 = pfVar239[0x22];
              fVar78 = pfVar239[0x23];
              fVar79 = pfVar239[0x24];
              fVar80 = pfVar239[0x25];
              fVar81 = pfVar239[0x26];
              pfVar239 = pfVar239 + 0x20;
              pfVar242 = (float *)((long)pvVar24 + lVar251 + 0x20);
              fVar82 = *pfVar242;
              fVar83 = pfVar242[1];
              fVar84 = pfVar242[2];
              fVar85 = pfVar242[3];
              fVar86 = pfVar242[4];
              fVar87 = pfVar242[5];
              fVar88 = pfVar242[6];
              pfVar5 = (float *)((long)pvVar24 + lVar251 + 0x60);
              fVar89 = *pfVar5;
              fVar90 = pfVar5[1];
              fVar91 = pfVar5[2];
              fVar92 = pfVar5[3];
              fVar93 = pfVar5[4];
              fVar94 = pfVar5[5];
              fVar95 = pfVar5[6];
              fVar96 = pfVar5[7];
              fVar273 = in_register_0000149c + fVar287;
              fVar276 = in_register_000014dc + fVar287;
              fVar260 = fVar287 + in_register_0000139c + *pfVar4 + *pfVar6;
              fVar262 = in_register_0000151c + *pfVar7;
              fVar263 = pfVar242[7] + in_register_000013dc;
              pfVar242 = (float *)((long)pvVar24 + lVar251 + 0x80);
              fVar97 = *pfVar242;
              fVar98 = pfVar242[1];
              fVar99 = pfVar242[2];
              fVar100 = pfVar242[3];
              fVar101 = pfVar242[4];
              fVar102 = pfVar242[5];
              fVar103 = pfVar242[6];
              pfVar5 = (float *)((long)pvVar24 + lVar251 + 0xa0);
              fVar104 = *pfVar5;
              fVar105 = pfVar5[1];
              fVar106 = pfVar5[2];
              fVar107 = pfVar5[3];
              fVar108 = pfVar5[4];
              fVar109 = pfVar5[5];
              fVar110 = pfVar5[6];
              fVar111 = pfVar252[8];
              fVar112 = pfVar252[9];
              fVar113 = pfVar252[10];
              fVar114 = pfVar252[0xb];
              fVar115 = pfVar252[0xc];
              fVar116 = pfVar252[0xd];
              fVar117 = pfVar252[0xe];
              fVar118 = pfVar252[0xf];
              fVar119 = pfVar252[0x10];
              fVar120 = pfVar252[0x11];
              fVar121 = pfVar252[0x12];
              fVar122 = pfVar252[0x13];
              fVar123 = pfVar252[0x14];
              fVar124 = pfVar252[0x15];
              fVar125 = pfVar252[0x16];
              fVar126 = pfVar252[0x18];
              fVar268 = pfVar252[0x19];
              fVar270 = pfVar252[0x1a];
              fVar127 = pfVar252[0x1b];
              fVar128 = pfVar252[0x1c];
              fVar129 = pfVar252[0x1d];
              fVar130 = pfVar252[0x1e];
              fVar131 = pfVar252[0x20];
              fVar132 = pfVar252[0x21];
              fVar133 = pfVar252[0x22];
              fVar134 = pfVar252[0x23];
              fVar135 = pfVar252[0x24];
              fVar278 = pfVar252[0x25];
              fVar136 = pfVar252[0x26];
              fVar137 = pfVar252[0x27];
              fVar138 = *pfVar252;
              fVar139 = pfVar252[1];
              fVar140 = pfVar252[2];
              fVar141 = pfVar252[3];
              fVar142 = pfVar252[4];
              fVar143 = pfVar252[5];
              fVar144 = pfVar252[6];
              fVar277 = in_register_0000151c + fVar276;
              fVar279 = in_register_0000155c + in_register_0000151c;
              fVar145 = pfVar252[0x28];
              fVar146 = pfVar252[0x29];
              fVar147 = pfVar252[0x2a];
              fVar148 = pfVar252[0x2b];
              fVar149 = pfVar252[0x2c];
              fVar150 = pfVar252[0x2d];
              fVar151 = pfVar252[0x2e];
              pfVar252 = pfVar252 + 0x20;
              pfVar5 = (float *)((long)pvVar24 + lVar251 + 0xc0);
              fVar152 = *pfVar5;
              fVar266 = pfVar5[1];
              fVar153 = pfVar5[2];
              fVar154 = pfVar5[3];
              fVar155 = pfVar5[4];
              fVar156 = pfVar5[5];
              fVar157 = pfVar5[6];
              pfVar4 = (float *)((long)pvVar24 + lVar251 + 0xe0);
              fVar158 = *pfVar4;
              fVar159 = pfVar4[1];
              fVar160 = pfVar4[2];
              fVar161 = pfVar4[3];
              fVar162 = pfVar4[4];
              fVar163 = pfVar4[5];
              fVar164 = pfVar4[6];
              pfVar6 = (float *)((long)pvVar24 + lVar251 + 0x100);
              fVar193 = *pfVar6;
              fVar194 = pfVar6[1];
              fVar195 = pfVar6[2];
              fVar196 = pfVar6[3];
              fVar197 = pfVar6[4];
              fVar198 = pfVar6[5];
              fVar199 = pfVar6[6];
              in_register_0000135c = pfVar6[7];
              fVar165 = pfVar240[8];
              fVar166 = pfVar240[9];
              fVar167 = pfVar240[10];
              fVar168 = pfVar240[0xb];
              fVar169 = pfVar240[0xc];
              fVar170 = pfVar240[0xd];
              fVar171 = pfVar240[0xe];
              fVar200 = pfVar240[0x10];
              fVar267 = pfVar240[0x11];
              fVar258 = pfVar240[0x12];
              fVar265 = pfVar240[0x13];
              fVar269 = pfVar240[0x14];
              fVar201 = pfVar240[0x15];
              fVar202 = pfVar240[0x16];
              in_register_0000145c = pfVar240[0x17];
              fVar203 = pfVar240[0x18];
              fVar253 = pfVar240[0x19];
              fVar254 = pfVar240[0x1a];
              fVar256 = pfVar240[0x1b];
              fVar257 = pfVar240[0x1c];
              fVar259 = pfVar240[0x1d];
              fVar261 = pfVar240[0x1e];
              in_register_0000149c = pfVar240[0x1f];
              fVar172 = pfVar240[0x20];
              fVar173 = pfVar240[0x21];
              fVar174 = pfVar240[0x22];
              fVar175 = pfVar240[0x23];
              fVar264 = pfVar240[0x24];
              fVar176 = pfVar240[0x25];
              fVar177 = pfVar240[0x26];
              fVar178 = pfVar240[0x27];
              fVar179 = *pfVar240;
              fVar180 = pfVar240[1];
              fVar181 = pfVar240[2];
              fVar182 = pfVar240[3];
              fVar183 = pfVar240[4];
              fVar184 = pfVar240[5];
              fVar185 = pfVar240[6];
              in_register_0000141c = fVar277 + pfVar240[0xf];
              in_register_000014dc = fVar279 + fVar277;
              in_register_0000151c = in_register_0000155c + fVar279;
              fVar186 = pfVar240[0x28];
              fVar187 = pfVar240[0x29];
              fVar188 = pfVar240[0x2a];
              fVar189 = pfVar240[0x2b];
              fVar190 = pfVar240[0x2c];
              fVar191 = pfVar240[0x2d];
              fVar192 = pfVar240[0x2e];
              pfVar240 = pfVar240 + 0x20;
              in_register_0000139c = pfVar5[7] + pfVar4[7];
              fVar271 = in_register_0000141c + pfVar4[7];
              in_register_000013dc = in_register_000014dc + fVar271;
              in_register_000012dc =
                   fVar287 + pfVar3[7] + fVar263 + in_register_0000155c + fVar96 + pfVar242[7] +
                   in_register_0000155c + in_register_0000139c;
              *pfVar250 = fVar280 + fVar46 * fVar61 + fVar82 * fVar25 + fVar32 * fVar53 +
                          fVar89 * fVar138 + fVar111 * fVar97 + fVar119 * fVar104 +
                          fVar152 * fVar179 + fVar165 * fVar158 + fVar200 * fVar193;
              pfVar250[1] = fVar281 + fVar47 * fVar62 + fVar83 * fVar26 + fVar33 * fVar54 +
                            fVar90 * fVar139 + fVar112 * fVar98 + fVar120 * fVar105 +
                            fVar266 * fVar180 + fVar166 * fVar159 + fVar267 * fVar194;
              pfVar250[2] = fVar282 + fVar48 * fVar63 + fVar84 * fVar27 + fVar34 * fVar55 +
                            fVar91 * fVar140 + fVar113 * fVar99 + fVar121 * fVar106 +
                            fVar153 * fVar181 + fVar167 * fVar160 + fVar258 * fVar195;
              pfVar250[3] = fVar283 + fVar49 * fVar64 + fVar85 * fVar28 + fVar35 * fVar56 +
                            fVar92 * fVar141 + fVar114 * fVar100 + fVar122 * fVar107 +
                            fVar154 * fVar182 + fVar168 * fVar161 + fVar265 * fVar196;
              pfVar250[4] = fVar284 + fVar50 * fVar65 + fVar86 * fVar29 + fVar36 * fVar57 +
                            fVar93 * fVar142 + fVar115 * fVar101 + fVar123 * fVar108 +
                            fVar155 * fVar183 + fVar169 * fVar162 + fVar269 * fVar197;
              pfVar250[5] = fVar285 + fVar51 * fVar66 + fVar87 * fVar30 + fVar37 * fVar58 +
                            fVar94 * fVar143 + fVar116 * fVar102 + fVar124 * fVar109 +
                            fVar156 * fVar184 + fVar170 * fVar163 + fVar201 * fVar198;
              pfVar250[6] = fVar286 + fVar52 * fVar67 + fVar88 * fVar31 + fVar38 * fVar59 +
                            fVar95 * fVar144 + fVar117 * fVar103 + fVar125 * fVar110 +
                            fVar157 * fVar185 + fVar171 * fVar164 + fVar202 * fVar199;
              pfVar250[7] = fVar260 + fVar276 + fVar118 + fVar96 + fVar271;
              pfVar250[8] = fVar25 * fVar46 + fVar280 + fVar82 * fVar32 + fVar39 * fVar53 +
                            fVar111 * fVar89 + fVar119 * fVar97 + fVar126 * fVar104 +
                            fVar165 * fVar152 + fVar200 * fVar158 + fVar203 * fVar193;
              pfVar250[9] = fVar26 * fVar47 + fVar281 + fVar83 * fVar33 + fVar40 * fVar54 +
                            fVar112 * fVar90 + fVar120 * fVar98 + fVar268 * fVar105 +
                            fVar166 * fVar266 + fVar267 * fVar159 + fVar253 * fVar194;
              pfVar250[10] = fVar27 * fVar48 + fVar282 + fVar84 * fVar34 + fVar41 * fVar55 +
                             fVar113 * fVar91 + fVar121 * fVar99 + fVar270 * fVar106 +
                             fVar167 * fVar153 + fVar258 * fVar160 + fVar254 * fVar195;
              pfVar250[0xb] =
                   fVar28 * fVar49 + fVar283 + fVar85 * fVar35 + fVar42 * fVar56 +
                   fVar114 * fVar92 + fVar122 * fVar100 + fVar127 * fVar107 +
                   fVar168 * fVar154 + fVar265 * fVar161 + fVar256 * fVar196;
              pfVar250[0xc] =
                   fVar29 * fVar50 + fVar284 + fVar86 * fVar36 + fVar43 * fVar57 +
                   fVar115 * fVar93 + fVar123 * fVar101 + fVar128 * fVar108 +
                   fVar169 * fVar155 + fVar269 * fVar162 + fVar257 * fVar197;
              pfVar250[0xd] =
                   fVar30 * fVar51 + fVar285 + fVar87 * fVar37 + fVar44 * fVar58 +
                   fVar116 * fVar94 + fVar124 * fVar102 + fVar129 * fVar109 +
                   fVar170 * fVar156 + fVar201 * fVar163 + fVar259 * fVar198;
              pfVar250[0xe] =
                   fVar31 * fVar52 + fVar286 + fVar88 * fVar38 + fVar45 * fVar59 +
                   fVar117 * fVar95 + fVar125 * fVar103 + fVar130 * fVar110 +
                   fVar171 * fVar157 + fVar202 * fVar164 + fVar261 * fVar199;
              pfVar250[0xf] = fVar273 + fVar262 + fVar277 + fVar260 + in_register_000013dc;
              pfVar250[0x10] =
                   fVar32 * fVar46 + fVar280 + fVar82 * fVar39 + fVar75 * fVar53 +
                   fVar119 * fVar89 + fVar126 * fVar97 + fVar131 * fVar104 +
                   fVar200 * fVar152 + fVar203 * fVar158 + fVar172 * fVar193;
              pfVar250[0x11] =
                   fVar33 * fVar47 + fVar281 + fVar83 * fVar40 + fVar76 * fVar54 +
                   fVar120 * fVar90 + fVar268 * fVar98 + fVar132 * fVar105 +
                   fVar267 * fVar266 + fVar253 * fVar159 + fVar173 * fVar194;
              pfVar250[0x12] =
                   fVar34 * fVar48 + fVar282 + fVar84 * fVar41 + fVar77 * fVar55 +
                   fVar121 * fVar91 + fVar270 * fVar99 + fVar133 * fVar106 +
                   fVar258 * fVar153 + fVar254 * fVar160 + fVar174 * fVar195;
              pfVar250[0x13] =
                   fVar35 * fVar49 + fVar283 + fVar85 * fVar42 + fVar78 * fVar56 +
                   fVar122 * fVar92 + fVar127 * fVar100 + fVar134 * fVar107 +
                   fVar265 * fVar154 + fVar256 * fVar161 + fVar175 * fVar196;
              pfVar250[0x14] =
                   fVar36 * fVar50 + fVar284 + fVar86 * fVar43 + fVar79 * fVar57 +
                   fVar123 * fVar93 + fVar128 * fVar101 + fVar135 * fVar108 +
                   fVar269 * fVar155 + fVar257 * fVar162 + fVar264 * fVar197;
              pfVar250[0x15] =
                   fVar37 * fVar51 + fVar285 + fVar87 * fVar44 + fVar80 * fVar58 +
                   fVar124 * fVar94 + fVar129 * fVar102 + fVar278 * fVar109 +
                   fVar201 * fVar156 + fVar259 * fVar163 + fVar176 * fVar198;
              pfVar250[0x16] =
                   fVar38 * fVar52 + fVar286 + fVar88 * fVar45 + fVar81 * fVar59 +
                   fVar125 * fVar95 + fVar130 * fVar103 + fVar136 * fVar110 +
                   fVar202 * fVar157 + fVar261 * fVar164 + fVar177 * fVar199;
              pfVar250[0x17] =
                   fVar276 + in_register_0000155c + fVar60 + fVar279 + fVar137 +
                   in_register_0000151c + fVar178;
              pfVar250[0x18] =
                   fVar280 + fVar39 * fVar46 + fVar75 * fVar82 + fVar53 * fVar68 +
                   fVar104 * fVar145 + fVar126 * fVar89 + fVar131 * fVar97 +
                   fVar193 * fVar186 + fVar203 * fVar152 + fVar172 * fVar158;
              pfVar250[0x19] =
                   fVar281 + fVar40 * fVar47 + fVar76 * fVar83 + fVar54 * fVar69 +
                   fVar105 * fVar146 + fVar268 * fVar90 + fVar132 * fVar98 +
                   fVar194 * fVar187 + fVar253 * fVar266 + fVar173 * fVar159;
              pfVar250[0x1a] =
                   fVar282 + fVar41 * fVar48 + fVar77 * fVar84 + fVar55 * fVar70 +
                   fVar106 * fVar147 + fVar270 * fVar91 + fVar133 * fVar99 +
                   fVar195 * fVar188 + fVar254 * fVar153 + fVar174 * fVar160;
              pfVar250[0x1b] =
                   fVar283 + fVar42 * fVar49 + fVar78 * fVar85 + fVar56 * fVar71 +
                   fVar107 * fVar148 + fVar127 * fVar92 + fVar134 * fVar100 +
                   fVar196 * fVar189 + fVar256 * fVar154 + fVar175 * fVar161;
              pfVar250[0x1c] =
                   fVar284 + fVar43 * fVar50 + fVar79 * fVar86 + fVar57 * fVar72 +
                   fVar108 * fVar149 + fVar128 * fVar93 + fVar135 * fVar101 +
                   fVar197 * fVar190 + fVar257 * fVar155 + fVar264 * fVar162;
              pfVar250[0x1d] =
                   fVar285 + fVar44 * fVar51 + fVar80 * fVar87 + fVar58 * fVar73 +
                   fVar109 * fVar150 + fVar129 * fVar94 + fVar278 * fVar102 +
                   fVar198 * fVar191 + fVar259 * fVar156 + fVar176 * fVar163;
              pfVar250[0x1e] =
                   fVar286 + fVar45 * fVar52 + fVar81 * fVar88 + fVar59 * fVar74 +
                   fVar110 * fVar151 + fVar130 * fVar95 + fVar136 * fVar103 +
                   fVar199 * fVar192 + fVar261 * fVar157 + fVar177 * fVar164;
              pfVar250[0x1f] = in_register_000012dc;
              pfVar250 = pfVar250 + 0x20;
              iVar241 = iVar241 + 4;
              uVar246 = uVar22 & 0xfffffffc;
            } while (iVar241 < (int)uVar22);
          }
          if ((int)(uVar246 | 1) < (int)uVar22) {
            lVar247 = 0;
            uVar245 = uVar246;
            do {
              pfVar242 = (float *)((long)pfVar239 + lVar247 + 0x20);
              fVar25 = *pfVar242;
              fVar26 = pfVar242[1];
              fVar27 = pfVar242[2];
              fVar28 = pfVar242[3];
              fVar29 = pfVar242[4];
              fVar30 = pfVar242[5];
              fVar31 = pfVar242[6];
              fVar32 = pfVar242[7];
              pfVar242 = (float *)((long)pfVar239 + lVar247 + 0x40);
              fVar33 = *pfVar242;
              fVar34 = pfVar242[1];
              fVar35 = pfVar242[2];
              fVar36 = pfVar242[3];
              fVar37 = pfVar242[4];
              fVar38 = pfVar242[5];
              fVar39 = pfVar242[6];
              fVar40 = pfVar242[7];
              pfVar242 = (float *)((long)pvVar24 + lVar251);
              fVar41 = *pfVar242;
              fVar42 = pfVar242[1];
              fVar43 = pfVar242[2];
              fVar44 = pfVar242[3];
              fVar45 = pfVar242[4];
              fVar46 = pfVar242[5];
              fVar47 = pfVar242[6];
              fVar48 = pfVar242[7];
              pfVar242 = (float *)((long)pvVar24 + lVar251 + 0x20);
              fVar49 = *pfVar242;
              fVar50 = pfVar242[1];
              fVar51 = pfVar242[2];
              fVar52 = pfVar242[3];
              fVar53 = pfVar242[4];
              fVar54 = pfVar242[5];
              fVar55 = pfVar242[6];
              fVar56 = pfVar242[7];
              pfVar242 = (float *)((long)pvVar24 + lVar251 + 0x40);
              fVar57 = *pfVar242;
              fVar58 = pfVar242[1];
              fVar59 = pfVar242[2];
              fVar60 = pfVar242[3];
              fVar61 = pfVar242[4];
              fVar62 = pfVar242[5];
              fVar63 = pfVar242[6];
              pfVar242 = (float *)((long)pfVar239 + lVar247);
              fVar64 = pfVar242[1];
              fVar65 = pfVar242[2];
              fVar66 = pfVar242[3];
              fVar67 = pfVar242[4];
              fVar68 = pfVar242[5];
              fVar69 = pfVar242[6];
              pfVar5 = (float *)((long)pvVar24 + lVar251 + 0x60);
              fVar70 = *pfVar5;
              fVar71 = pfVar5[1];
              fVar72 = pfVar5[2];
              fVar73 = pfVar5[3];
              fVar74 = pfVar5[4];
              fVar75 = pfVar5[5];
              fVar76 = pfVar5[6];
              fVar77 = pfVar5[7];
              fVar264 = fVar287 + in_register_0000135c;
              pfVar5 = (float *)((long)pfVar239 + lVar247 + 0x60);
              fVar78 = *pfVar5;
              fVar79 = pfVar5[1];
              fVar80 = pfVar5[2];
              fVar81 = pfVar5[3];
              fVar82 = pfVar5[4];
              fVar83 = pfVar5[5];
              fVar84 = pfVar5[6];
              pfVar5 = (float *)((long)pvVar24 + lVar251 + 0x80);
              fVar85 = *pfVar5;
              fVar86 = pfVar5[1];
              fVar87 = pfVar5[2];
              fVar88 = pfVar5[3];
              fVar89 = pfVar5[4];
              fVar90 = pfVar5[5];
              fVar91 = pfVar5[6];
              fVar92 = pfVar5[7];
              pfVar5 = (float *)((long)pvVar24 + lVar251 + 0xa0);
              fVar93 = *pfVar5;
              fVar94 = pfVar5[1];
              fVar95 = pfVar5[2];
              fVar96 = pfVar5[3];
              fVar97 = pfVar5[4];
              fVar98 = pfVar5[5];
              fVar99 = pfVar5[6];
              fVar100 = pfVar5[7];
              pfVar5 = (float *)((long)pfVar252 + lVar247 + 0x20);
              fVar101 = *pfVar5;
              fVar102 = pfVar5[1];
              fVar103 = pfVar5[2];
              fVar104 = pfVar5[3];
              fVar105 = pfVar5[4];
              fVar106 = pfVar5[5];
              fVar107 = pfVar5[6];
              fVar108 = pfVar5[7];
              pfVar5 = (float *)((long)pfVar252 + lVar247 + 0x40);
              fVar109 = *pfVar5;
              fVar110 = pfVar5[1];
              fVar111 = pfVar5[2];
              fVar112 = pfVar5[3];
              fVar113 = pfVar5[4];
              fVar114 = pfVar5[5];
              fVar115 = pfVar5[6];
              fVar116 = pfVar5[7];
              pfVar5 = (float *)((long)pfVar252 + lVar247);
              fVar117 = pfVar5[1];
              fVar118 = pfVar5[2];
              fVar119 = pfVar5[3];
              fVar120 = pfVar5[4];
              fVar121 = pfVar5[5];
              fVar122 = pfVar5[6];
              pfVar3 = (float *)((long)pfVar252 + lVar247 + 0x60);
              fVar123 = *pfVar3;
              fVar124 = pfVar3[1];
              fVar125 = pfVar3[2];
              fVar126 = pfVar3[3];
              fVar268 = pfVar3[4];
              fVar270 = pfVar3[5];
              fVar127 = pfVar3[6];
              pfVar3 = (float *)((long)pvVar24 + lVar251 + 0xc0);
              fVar128 = *pfVar3;
              fVar129 = pfVar3[1];
              fVar130 = pfVar3[2];
              fVar131 = pfVar3[3];
              fVar132 = pfVar3[4];
              fVar133 = pfVar3[5];
              fVar134 = pfVar3[6];
              fVar135 = pfVar3[7];
              pfVar3 = (float *)((long)pvVar24 + lVar251 + 0xe0);
              fVar278 = *pfVar3;
              fVar136 = pfVar3[1];
              fVar137 = pfVar3[2];
              fVar138 = pfVar3[3];
              fVar139 = pfVar3[4];
              fVar140 = pfVar3[5];
              fVar141 = pfVar3[6];
              fVar142 = pfVar3[7];
              pfVar3 = (float *)((long)pvVar24 + lVar251 + 0x100);
              fVar143 = *pfVar3;
              fVar144 = pfVar3[1];
              fVar145 = pfVar3[2];
              fVar146 = pfVar3[3];
              fVar147 = pfVar3[4];
              fVar148 = pfVar3[5];
              fVar149 = pfVar3[6];
              pfVar4 = (float *)((long)pfVar240 + lVar247 + 0x20);
              fVar150 = *pfVar4;
              fVar151 = pfVar4[1];
              fVar152 = pfVar4[2];
              fVar266 = pfVar4[3];
              fVar153 = pfVar4[4];
              fVar154 = pfVar4[5];
              fVar155 = pfVar4[6];
              pfVar3 = (float *)((long)pfVar240 + lVar247 + 0x40);
              fVar169 = *pfVar3;
              fVar170 = pfVar3[1];
              fVar171 = pfVar3[2];
              fVar172 = pfVar3[3];
              fVar173 = pfVar3[4];
              fVar174 = pfVar3[5];
              fVar175 = pfVar3[6];
              in_register_0000139c = pfVar3[7];
              pfVar3 = (float *)((long)pfVar240 + lVar247);
              fVar156 = pfVar3[1];
              fVar157 = pfVar3[2];
              fVar158 = pfVar3[3];
              fVar159 = pfVar3[4];
              fVar160 = pfVar3[5];
              fVar161 = pfVar3[6];
              in_register_0000135c = in_register_000013dc + pfVar4[7];
              in_register_000012dc = in_register_0000135c + fVar142;
              pfVar4 = (float *)((long)pfVar240 + lVar247 + 0x60);
              fVar162 = *pfVar4;
              fVar163 = pfVar4[1];
              fVar164 = pfVar4[2];
              fVar165 = pfVar4[3];
              fVar166 = pfVar4[4];
              fVar167 = pfVar4[5];
              fVar168 = pfVar4[6];
              pfVar4 = (float *)((long)pfVar250 + lVar247);
              *pfVar4 = fVar280 + fVar41 * *pfVar242 + fVar25 * fVar49 + fVar33 * fVar57 +
                        fVar70 * *pfVar5 + fVar101 * fVar85 + fVar109 * fVar93 +
                        fVar128 * *pfVar3 + fVar150 * fVar278 + fVar169 * fVar143;
              pfVar4[1] = fVar281 + fVar42 * fVar64 + fVar26 * fVar50 + fVar34 * fVar58 +
                          fVar71 * fVar117 + fVar102 * fVar86 + fVar110 * fVar94 +
                          fVar129 * fVar156 + fVar151 * fVar136 + fVar170 * fVar144;
              pfVar4[2] = fVar282 + fVar43 * fVar65 + fVar27 * fVar51 + fVar35 * fVar59 +
                          fVar72 * fVar118 + fVar103 * fVar87 + fVar111 * fVar95 +
                          fVar130 * fVar157 + fVar152 * fVar137 + fVar171 * fVar145;
              pfVar4[3] = fVar283 + fVar44 * fVar66 + fVar28 * fVar52 + fVar36 * fVar60 +
                          fVar73 * fVar119 + fVar104 * fVar88 + fVar112 * fVar96 +
                          fVar131 * fVar158 + fVar266 * fVar138 + fVar172 * fVar146;
              pfVar4[4] = fVar284 + fVar45 * fVar67 + fVar29 * fVar53 + fVar37 * fVar61 +
                          fVar74 * fVar120 + fVar105 * fVar89 + fVar113 * fVar97 +
                          fVar132 * fVar159 + fVar153 * fVar139 + fVar173 * fVar147;
              pfVar4[5] = fVar285 + fVar46 * fVar68 + fVar30 * fVar54 + fVar38 * fVar62 +
                          fVar75 * fVar121 + fVar106 * fVar90 + fVar114 * fVar98 +
                          fVar133 * fVar160 + fVar154 * fVar140 + fVar174 * fVar148;
              pfVar4[6] = fVar286 + fVar47 * fVar69 + fVar31 * fVar55 + fVar39 * fVar63 +
                          fVar76 * fVar122 + fVar107 * fVar91 + fVar115 * fVar99 +
                          fVar134 * fVar161 + fVar155 * fVar141 + fVar175 * fVar149;
              pfVar4[7] = fVar264 + fVar32 + fVar40 + in_register_000013dc + fVar108 + fVar116 +
                          in_register_000012dc;
              pfVar242 = (float *)((long)pfVar250 + lVar247 + 0x20);
              *pfVar242 = fVar280 + fVar25 * fVar41 + fVar33 * fVar49 + fVar57 * fVar78 +
                          fVar101 * fVar70 + fVar109 * fVar85 + fVar93 * fVar123 +
                          fVar150 * fVar128 + fVar169 * fVar278 + fVar143 * fVar162;
              pfVar242[1] = fVar281 + fVar26 * fVar42 + fVar34 * fVar50 + fVar58 * fVar79 +
                            fVar102 * fVar71 + fVar110 * fVar86 + fVar94 * fVar124 +
                            fVar151 * fVar129 + fVar170 * fVar136 + fVar144 * fVar163;
              pfVar242[2] = fVar282 + fVar27 * fVar43 + fVar35 * fVar51 + fVar59 * fVar80 +
                            fVar103 * fVar72 + fVar111 * fVar87 + fVar95 * fVar125 +
                            fVar152 * fVar130 + fVar171 * fVar137 + fVar145 * fVar164;
              pfVar242[3] = fVar283 + fVar28 * fVar44 + fVar36 * fVar52 + fVar60 * fVar81 +
                            fVar104 * fVar73 + fVar112 * fVar88 + fVar96 * fVar126 +
                            fVar266 * fVar131 + fVar172 * fVar138 + fVar146 * fVar165;
              pfVar242[4] = fVar284 + fVar29 * fVar45 + fVar37 * fVar53 + fVar61 * fVar82 +
                            fVar105 * fVar74 + fVar113 * fVar89 + fVar97 * fVar268 +
                            fVar153 * fVar132 + fVar173 * fVar139 + fVar147 * fVar166;
              pfVar242[5] = fVar285 + fVar30 * fVar46 + fVar38 * fVar54 + fVar62 * fVar83 +
                            fVar106 * fVar75 + fVar114 * fVar90 + fVar98 * fVar270 +
                            fVar154 * fVar133 + fVar174 * fVar140 + fVar148 * fVar167;
              pfVar242[6] = fVar286 + fVar31 * fVar47 + fVar39 * fVar55 + fVar63 * fVar84 +
                            fVar107 * fVar76 + fVar115 * fVar91 + fVar99 * fVar127 +
                            fVar155 * fVar134 + fVar175 * fVar141 + fVar149 * fVar168;
              pfVar242[7] = fVar287 + fVar48 + fVar56 + fVar40 + fVar77 + fVar92 + fVar100 +
                            fVar135 + fVar142 + in_register_000012dc;
              uVar246 = uVar245 + 2;
              lVar247 = lVar247 + 0x40;
              iVar241 = uVar245 + 3;
              uVar245 = uVar246;
            } while (iVar241 < (int)uVar22);
            pfVar250 = (float *)((long)pfVar250 + lVar247);
            pfVar239 = (float *)((long)pfVar239 + lVar247);
            pfVar252 = (float *)((long)pfVar252 + lVar247);
            pfVar240 = (float *)((long)pfVar240 + lVar247);
          }
          if ((int)uVar246 < (int)uVar22) {
            iVar241 = uVar22 - uVar246;
            lVar243 = 0x40;
            lVar247 = 0;
            do {
              pfVar4 = (float *)((long)pfVar239 + lVar243 + -0x40);
              fVar25 = pfVar4[1];
              fVar26 = pfVar4[2];
              fVar27 = pfVar4[3];
              fVar28 = pfVar4[4];
              fVar29 = pfVar4[5];
              fVar30 = pfVar4[6];
              fVar31 = pfVar4[7];
              pfVar6 = (float *)((long)pfVar239 + lVar243 + -0x20);
              fVar32 = pfVar6[1];
              fVar33 = pfVar6[2];
              fVar34 = pfVar6[3];
              fVar35 = pfVar6[4];
              fVar36 = pfVar6[5];
              fVar37 = pfVar6[6];
              fVar38 = pfVar6[7];
              pfVar13 = (float *)((long)pvVar24 + lVar251);
              fVar39 = pfVar13[1];
              fVar40 = pfVar13[2];
              fVar41 = pfVar13[3];
              fVar42 = pfVar13[4];
              fVar43 = pfVar13[5];
              fVar44 = pfVar13[6];
              pfVar242 = (float *)((long)pfVar239 + lVar243);
              fVar45 = pfVar242[1];
              fVar46 = pfVar242[2];
              fVar47 = pfVar242[3];
              fVar48 = pfVar242[4];
              fVar49 = pfVar242[5];
              fVar50 = pfVar242[6];
              fVar51 = pfVar242[7];
              pfVar7 = (float *)((long)pvVar24 + lVar251 + 0x20);
              fVar52 = pfVar7[1];
              fVar53 = pfVar7[2];
              fVar54 = pfVar7[3];
              fVar55 = pfVar7[4];
              fVar56 = pfVar7[5];
              fVar57 = pfVar7[6];
              pfVar8 = (float *)((long)pvVar24 + lVar251 + 0x40);
              fVar58 = pfVar8[1];
              fVar59 = pfVar8[2];
              fVar60 = pfVar8[3];
              fVar61 = pfVar8[4];
              fVar62 = pfVar8[5];
              fVar63 = pfVar8[6];
              pfVar12 = (float *)((long)pfVar252 + lVar243 + -0x40);
              fVar64 = pfVar12[1];
              fVar65 = pfVar12[2];
              fVar66 = pfVar12[3];
              fVar67 = pfVar12[4];
              fVar68 = pfVar12[5];
              fVar69 = pfVar12[6];
              fVar70 = pfVar12[7];
              pfVar14 = (float *)((long)pfVar252 + lVar243 + -0x20);
              fVar71 = pfVar14[1];
              fVar72 = pfVar14[2];
              fVar73 = pfVar14[3];
              fVar74 = pfVar14[4];
              fVar75 = pfVar14[5];
              fVar76 = pfVar14[6];
              fVar77 = pfVar14[7];
              pfVar15 = (float *)((long)pvVar24 + lVar251 + 0x60);
              fVar78 = pfVar15[1];
              fVar79 = pfVar15[2];
              fVar80 = pfVar15[3];
              fVar81 = pfVar15[4];
              fVar82 = pfVar15[5];
              fVar83 = pfVar15[6];
              pfVar5 = (float *)((long)pfVar252 + lVar243);
              fVar84 = pfVar5[1];
              fVar85 = pfVar5[2];
              fVar86 = pfVar5[3];
              fVar87 = pfVar5[4];
              fVar88 = pfVar5[5];
              fVar89 = pfVar5[6];
              pfVar16 = (float *)((long)pvVar24 + lVar251 + 0x80);
              fVar90 = pfVar16[1];
              fVar91 = pfVar16[2];
              fVar92 = pfVar16[3];
              fVar93 = pfVar16[4];
              fVar94 = pfVar16[5];
              fVar95 = pfVar16[6];
              pfVar17 = (float *)((long)pvVar24 + lVar251 + 0xa0);
              fVar96 = pfVar17[1];
              fVar97 = pfVar17[2];
              fVar98 = pfVar17[3];
              fVar99 = pfVar17[4];
              fVar100 = pfVar17[5];
              fVar101 = pfVar17[6];
              pfVar9 = (float *)((long)pfVar240 + lVar243 + -0x40);
              fVar102 = pfVar9[1];
              fVar103 = pfVar9[2];
              fVar104 = pfVar9[3];
              fVar105 = pfVar9[4];
              fVar106 = pfVar9[5];
              fVar107 = pfVar9[6];
              fVar108 = pfVar9[7];
              pfVar10 = (float *)((long)pfVar240 + lVar243 + -0x20);
              fVar109 = pfVar10[1];
              fVar110 = pfVar10[2];
              fVar111 = pfVar10[3];
              fVar112 = pfVar10[4];
              fVar113 = pfVar10[5];
              fVar114 = pfVar10[6];
              fVar115 = pfVar10[7];
              pfVar18 = (float *)((long)pvVar24 + lVar251 + 0xc0);
              fVar116 = pfVar18[1];
              fVar117 = pfVar18[2];
              fVar118 = pfVar18[3];
              fVar119 = pfVar18[4];
              fVar120 = pfVar18[5];
              fVar121 = pfVar18[6];
              pfVar3 = (float *)((long)pfVar240 + lVar243);
              fVar132 = pfVar3[1];
              fVar133 = pfVar3[2];
              fVar134 = pfVar3[3];
              fVar135 = pfVar3[4];
              fVar278 = pfVar3[5];
              fVar136 = pfVar3[6];
              in_register_000012dc = pfVar3[7];
              pfVar19 = (float *)((long)pvVar24 + lVar251 + 0xe0);
              fVar122 = pfVar19[1];
              fVar123 = pfVar19[2];
              fVar124 = pfVar19[3];
              fVar125 = pfVar19[4];
              fVar126 = pfVar19[5];
              fVar268 = pfVar19[6];
              pfVar20 = (float *)((long)pvVar24 + lVar251 + 0x100);
              fVar270 = pfVar20[1];
              fVar127 = pfVar20[2];
              fVar128 = pfVar20[3];
              fVar129 = pfVar20[4];
              fVar130 = pfVar20[5];
              fVar131 = pfVar20[6];
              pfVar11 = (float *)((long)pfVar250 + lVar243 + -0x40);
              *pfVar11 = fVar280 + *pfVar4 * *pfVar13 + *pfVar6 * *pfVar7 + *pfVar242 * *pfVar8 +
                         *pfVar12 * *pfVar15 + *pfVar14 * *pfVar16 + *pfVar5 * *pfVar17 +
                         *pfVar9 * *pfVar18 + *pfVar10 * *pfVar19 + *pfVar3 * *pfVar20;
              pfVar11[1] = fVar281 + fVar25 * fVar39 + fVar32 * fVar52 + fVar45 * fVar58 +
                           fVar64 * fVar78 + fVar71 * fVar90 + fVar84 * fVar96 +
                           fVar102 * fVar116 + fVar109 * fVar122 + fVar132 * fVar270;
              pfVar11[2] = fVar282 + fVar26 * fVar40 + fVar33 * fVar53 + fVar46 * fVar59 +
                           fVar65 * fVar79 + fVar72 * fVar91 + fVar85 * fVar97 +
                           fVar103 * fVar117 + fVar110 * fVar123 + fVar133 * fVar127;
              pfVar11[3] = fVar283 + fVar27 * fVar41 + fVar34 * fVar54 + fVar47 * fVar60 +
                           fVar66 * fVar80 + fVar73 * fVar92 + fVar86 * fVar98 +
                           fVar104 * fVar118 + fVar111 * fVar124 + fVar134 * fVar128;
              pfVar11[4] = fVar284 + fVar28 * fVar42 + fVar35 * fVar55 + fVar48 * fVar61 +
                           fVar67 * fVar81 + fVar74 * fVar93 + fVar87 * fVar99 +
                           fVar105 * fVar119 + fVar112 * fVar125 + fVar135 * fVar129;
              pfVar11[5] = fVar285 + fVar29 * fVar43 + fVar36 * fVar56 + fVar49 * fVar62 +
                           fVar68 * fVar82 + fVar75 * fVar94 + fVar88 * fVar100 +
                           fVar106 * fVar120 + fVar113 * fVar126 + fVar278 * fVar130;
              pfVar11[6] = fVar286 + fVar30 * fVar44 + fVar37 * fVar57 + fVar50 * fVar63 +
                           fVar69 * fVar83 + fVar76 * fVar95 + fVar89 * fVar101 +
                           fVar107 * fVar121 + fVar114 * fVar268 + fVar136 * fVar131;
              pfVar11[7] = fVar287 + fVar31 + fVar38 + fVar51 + fVar70 + fVar77 + fVar77 +
                           fVar108 + fVar115 + fVar115;
              lVar247 = lVar247 + -0x20;
              lVar243 = lVar243 + 0x20;
              iVar241 = iVar241 + -1;
            } while (iVar241 != 0);
            pfVar250 = (float *)((long)pfVar250 - lVar247);
            pfVar239 = (float *)((long)pfVar239 - lVar247);
            pfVar252 = (float *)((long)pfVar252 - lVar247);
            pfVar240 = (float *)((long)pfVar240 - lVar247);
          }
          pfVar239 = pfVar239 + 0x10;
          pfVar252 = pfVar252 + 0x10;
          pfVar240 = pfVar240 + 0x10;
          uVar249 = uVar249 + 1;
        } while (uVar249 != uVar23);
      }
      lVar244 = lVar244 + 1;
    } while (lVar244 != iVar21);
  }
  return;
}

Assistant:

static void convdw3x3s1_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + g * 8) : _mm256_setzero_ps();

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);
        float* outptr1 = out.row(1);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        const float* r3 = img0.row(3);

        int i = 0;
        for (; i + 1 < outh; i += 2)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m256 _sum00 = _bias0;
                __m256 _sum01 = _bias0;
                __m256 _sum02 = _bias0;
                __m256 _sum03 = _bias0;
                __m256 _sum10 = _bias0;
                __m256 _sum11 = _bias0;
                __m256 _sum12 = _bias0;
                __m256 _sum13 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);
                __m256 _r04 = _mm256_load_ps(r0 + 32);
                __m256 _r05 = _mm256_load_ps(r0 + 40);

                _sum00 = _mm256_comp_fmadd_ps(_k00, _r00, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k00, _r01, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k00, _r02, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k00, _r03, _sum03);
                _sum00 = _mm256_comp_fmadd_ps(_k01, _r01, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k01, _r02, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k01, _r03, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k01, _r04, _sum03);
                _sum00 = _mm256_comp_fmadd_ps(_k02, _r02, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k02, _r03, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k02, _r04, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k02, _r05, _sum03);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);
                __m256 _r14 = _mm256_load_ps(r1 + 32);
                __m256 _r15 = _mm256_load_ps(r1 + 40);

                _sum10 = _mm256_comp_fmadd_ps(_k00, _r10, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k00, _r11, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k00, _r12, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k00, _r13, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k10, _r10, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k10, _r11, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k10, _r12, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k10, _r13, _sum03);

                _sum10 = _mm256_comp_fmadd_ps(_k01, _r11, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k01, _r12, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k01, _r13, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k01, _r14, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k11, _r11, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k11, _r12, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k11, _r13, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k11, _r14, _sum03);

                _sum10 = _mm256_comp_fmadd_ps(_k02, _r12, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k02, _r13, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k02, _r14, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k02, _r15, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k12, _r12, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k12, _r13, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k12, _r14, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k12, _r15, _sum03);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);
                __m256 _r24 = _mm256_load_ps(r2 + 32);
                __m256 _r25 = _mm256_load_ps(r2 + 40);

                _sum10 = _mm256_comp_fmadd_ps(_k10, _r20, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k10, _r21, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k10, _r22, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k10, _r23, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k20, _r20, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k20, _r21, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k20, _r22, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k20, _r23, _sum03);

                _sum10 = _mm256_comp_fmadd_ps(_k11, _r21, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k11, _r22, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k11, _r23, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k11, _r24, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k21, _r21, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k21, _r22, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k21, _r23, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k21, _r24, _sum03);

                _sum10 = _mm256_comp_fmadd_ps(_k12, _r22, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k12, _r23, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k12, _r24, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k12, _r25, _sum13);
                _sum00 = _mm256_comp_fmadd_ps(_k22, _r22, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k22, _r23, _sum01);
                _sum02 = _mm256_comp_fmadd_ps(_k22, _r24, _sum02);
                _sum03 = _mm256_comp_fmadd_ps(_k22, _r25, _sum03);

                __m256 _r30 = _mm256_load_ps(r3);
                __m256 _r31 = _mm256_load_ps(r3 + 8);
                __m256 _r32 = _mm256_load_ps(r3 + 16);
                __m256 _r33 = _mm256_load_ps(r3 + 24);
                __m256 _r34 = _mm256_load_ps(r3 + 32);
                __m256 _r35 = _mm256_load_ps(r3 + 40);

                _sum10 = _mm256_comp_fmadd_ps(_k20, _r30, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k20, _r31, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k20, _r32, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k20, _r33, _sum13);
                _sum10 = _mm256_comp_fmadd_ps(_k21, _r31, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k21, _r32, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k21, _r33, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k21, _r34, _sum13);
                _sum10 = _mm256_comp_fmadd_ps(_k22, _r32, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k22, _r33, _sum11);
                _sum12 = _mm256_comp_fmadd_ps(_k22, _r34, _sum12);
                _sum13 = _mm256_comp_fmadd_ps(_k22, _r35, _sum13);

                _mm256_store_ps(outptr0, _sum00);
                _mm256_store_ps(outptr0 + 8, _sum01);
                _mm256_store_ps(outptr0 + 16, _sum02);
                _mm256_store_ps(outptr0 + 24, _sum03);
                _mm256_store_ps(outptr1, _sum10);
                _mm256_store_ps(outptr1 + 8, _sum11);
                _mm256_store_ps(outptr1 + 16, _sum12);
                _mm256_store_ps(outptr1 + 24, _sum13);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                r3 += 32;
                outptr0 += 32;
                outptr1 += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _sum00 = _bias0;
                __m256 _sum01 = _bias0;
                __m256 _sum10 = _bias0;
                __m256 _sum11 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);

                _sum00 = _mm256_comp_fmadd_ps(_k00, _r00, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k00, _r01, _sum01);
                _sum00 = _mm256_comp_fmadd_ps(_k01, _r01, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k01, _r02, _sum01);
                _sum00 = _mm256_comp_fmadd_ps(_k02, _r02, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k02, _r03, _sum01);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);

                _sum00 = _mm256_comp_fmadd_ps(_k10, _r10, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k10, _r11, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k00, _r10, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k00, _r11, _sum11);

                _sum00 = _mm256_comp_fmadd_ps(_k11, _r11, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k11, _r12, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k01, _r11, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k01, _r12, _sum11);

                _sum00 = _mm256_comp_fmadd_ps(_k12, _r12, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k12, _r13, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k02, _r12, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k02, _r13, _sum11);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);

                _sum00 = _mm256_comp_fmadd_ps(_k20, _r20, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k20, _r21, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k10, _r20, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k10, _r21, _sum11);

                _sum00 = _mm256_comp_fmadd_ps(_k21, _r21, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k21, _r22, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k11, _r21, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k11, _r22, _sum11);

                _sum00 = _mm256_comp_fmadd_ps(_k22, _r22, _sum00);
                _sum01 = _mm256_comp_fmadd_ps(_k22, _r23, _sum01);
                _sum10 = _mm256_comp_fmadd_ps(_k12, _r22, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k12, _r23, _sum11);

                __m256 _r30 = _mm256_load_ps(r3);
                __m256 _r31 = _mm256_load_ps(r3 + 8);
                __m256 _r32 = _mm256_load_ps(r3 + 16);
                __m256 _r33 = _mm256_load_ps(r3 + 24);

                _sum10 = _mm256_comp_fmadd_ps(_k20, _r30, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k20, _r31, _sum11);
                _sum10 = _mm256_comp_fmadd_ps(_k21, _r31, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k21, _r32, _sum11);
                _sum10 = _mm256_comp_fmadd_ps(_k22, _r32, _sum10);
                _sum11 = _mm256_comp_fmadd_ps(_k22, _r33, _sum11);

                _mm256_store_ps(outptr0, _sum00);
                _mm256_store_ps(outptr0 + 8, _sum01);
                _mm256_store_ps(outptr1, _sum10);
                _mm256_store_ps(outptr1 + 8, _sum11);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                r3 += 16;
                outptr0 += 16;
                outptr1 += 16;
            }
            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;
                __m256 _sum1 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k00, _r10, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r11, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r12, _sum1);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r20, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r21, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r22, _sum1);

                __m256 _r30 = _mm256_load_ps(r3);
                __m256 _r31 = _mm256_load_ps(r3 + 8);
                __m256 _r32 = _mm256_load_ps(r3 + 16);

                _sum1 = _mm256_comp_fmadd_ps(_k20, _r30, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r31, _sum1);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r32, _sum1);

                _mm256_store_ps(outptr0, _sum0);
                _mm256_store_ps(outptr1, _sum1);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                r3 += 8;
                outptr0 += 8;
                outptr1 += 8;
            }

            r0 += 2 * 8 + w * 8;
            r1 += 2 * 8 + w * 8;
            r2 += 2 * 8 + w * 8;
            r3 += 2 * 8 + w * 8;

            outptr0 += outw * 8;
            outptr1 += outw * 8;
        }
        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 3 < outw; j += 4)
            {
                __m256 _sum0 = _bias0;
                __m256 _sum1 = _bias0;
                __m256 _sum2 = _bias0;
                __m256 _sum3 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);
                __m256 _r04 = _mm256_load_ps(r0 + 32);
                __m256 _r05 = _mm256_load_ps(r0 + 40);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k02, _r05, _sum3);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);
                __m256 _r14 = _mm256_load_ps(r1 + 32);
                __m256 _r15 = _mm256_load_ps(r1 + 40);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k12, _r15, _sum3);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);
                __m256 _r24 = _mm256_load_ps(r2 + 32);
                __m256 _r25 = _mm256_load_ps(r2 + 40);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_k22, _r24, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_k22, _r25, _sum3);

                _mm256_store_ps(outptr0, _sum0);
                _mm256_store_ps(outptr0 + 8, _sum1);
                _mm256_store_ps(outptr0 + 16, _sum2);
                _mm256_store_ps(outptr0 + 24, _sum3);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                outptr0 += 32;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m256 _sum0 = _bias0;
                __m256 _sum1 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k02, _r03, _sum1);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k12, _r13, _sum1);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_k22, _r23, _sum1);

                _mm256_store_ps(outptr0, _sum0);
                _mm256_store_ps(outptr0 + 8, _sum1);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr0 += 16;
            }
            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);

                __m256 _k10 = _mm256_load_ps(k0 + 24);
                __m256 _k11 = _mm256_load_ps(k0 + 32);
                __m256 _k12 = _mm256_load_ps(k0 + 40);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);

                __m256 _k20 = _mm256_load_ps(k0 + 48);
                __m256 _k21 = _mm256_load_ps(k0 + 56);
                __m256 _k22 = _mm256_load_ps(k0 + 64);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);

                _mm256_store_ps(outptr0, _sum0);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                outptr0 += 8;
            }

            r0 += 2 * 8;
            r1 += 2 * 8;
            r2 += 2 * 8;
        }
    }
}